

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

bool embree::sse2::CurveNiMBIntersectorK<4,4>::
     occluded_t<embree::sse2::RibbonCurve1IntersectorK<embree::CatmullRomCurveT,4,4>,embree::sse2::Occluded1KEpilogMU<4,4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  Primitive *pPVar7;
  undefined1 (*pauVar8) [12];
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  Primitive PVar17;
  int iVar18;
  Geometry *pGVar19;
  __int_type_conflict _Var20;
  long lVar21;
  long lVar22;
  undefined1 auVar23 [16];
  undefined8 uVar24;
  undefined6 uVar25;
  undefined1 auVar26 [12];
  undefined1 auVar27 [12];
  undefined1 auVar28 [12];
  undefined1 auVar29 [12];
  undefined1 auVar30 [12];
  undefined1 auVar31 [12];
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined1 auVar37 [12];
  undefined1 auVar38 [12];
  undefined1 auVar39 [12];
  undefined1 auVar40 [12];
  undefined1 auVar41 [12];
  undefined1 auVar42 [12];
  undefined1 auVar43 [12];
  undefined1 auVar44 [12];
  undefined1 auVar45 [12];
  undefined1 auVar46 [12];
  undefined8 uVar47;
  undefined8 uVar48;
  bool bVar49;
  bool bVar50;
  bool bVar51;
  bool bVar52;
  int iVar53;
  ulong uVar54;
  RTCFilterFunctionN p_Var55;
  RTCRayN *pRVar56;
  undefined4 uVar57;
  RTCIntersectArguments *pRVar58;
  undefined1 *puVar59;
  ulong uVar60;
  Geometry *pGVar61;
  Geometry *geometry;
  long lVar62;
  ulong uVar63;
  ulong uVar64;
  bool bVar65;
  uint uVar66;
  uint uVar67;
  uint uVar68;
  uint uVar69;
  uint uVar70;
  uint uVar71;
  short sVar72;
  undefined2 uVar104;
  float fVar73;
  float fVar105;
  float fVar106;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar78 [16];
  undefined1 auVar81 [16];
  undefined1 auVar84 [16];
  undefined1 auVar87 [16];
  undefined1 auVar90 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined8 uVar107;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar130;
  float fVar133;
  vfloat4 v_2;
  undefined1 auVar111 [16];
  undefined1 auVar114 [16];
  undefined1 auVar117 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  float fVar131;
  float fVar132;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  float fVar138;
  float fVar145;
  float fVar147;
  vfloat4 v;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  float fVar139;
  float fVar146;
  float fVar148;
  float fVar149;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  float fVar150;
  float fVar151;
  float fVar163;
  float fVar166;
  vfloat4 v_1;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar156 [16];
  float fVar164;
  float fVar165;
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  float fVar171;
  float fVar172;
  float fVar183;
  float fVar185;
  undefined1 auVar173 [16];
  float fVar184;
  float fVar186;
  float fVar187;
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  float fVar188;
  float fVar189;
  float fVar211;
  float fVar213;
  undefined1 auVar190 [16];
  undefined1 auVar193 [16];
  undefined1 auVar196 [16];
  undefined1 auVar199 [16];
  undefined1 auVar202 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  float fVar212;
  float fVar214;
  float fVar215;
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  float fVar216;
  float fVar217;
  float fVar222;
  float fVar224;
  undefined1 auVar218 [16];
  float fVar223;
  float fVar225;
  float fVar226;
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  float fVar227;
  float fVar228;
  float fVar229;
  float fVar235;
  float fVar236;
  float fVar237;
  float fVar238;
  float fVar239;
  float fVar240;
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar234 [16];
  float fVar241;
  float fVar242;
  float fVar243;
  float fVar246;
  float fVar247;
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  float fVar248;
  float fVar255;
  float fVar256;
  undefined1 auVar249 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  float fVar257;
  float fVar258;
  float fVar266;
  float fVar267;
  float fVar268;
  float fVar269;
  float fVar270;
  float fVar271;
  undefined1 auVar259 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  float fVar272;
  float fVar273;
  float fVar274;
  float fVar281;
  float fVar282;
  float fVar283;
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  float fVar284;
  float fVar285;
  float fVar293;
  float fVar295;
  float fVar297;
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  float fVar294;
  float fVar296;
  float fVar298;
  undefined1 auVar292 [16];
  float fVar299;
  float fVar300;
  float fVar305;
  float fVar306;
  float fVar307;
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  float fVar310;
  float fVar311;
  float fVar312;
  float fVar313;
  float fVar314;
  float fVar315;
  float fVar316;
  float fVar317;
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::CatmullRomCurveT<embree::Vec3fx>,_4> bhit;
  bool local_4e9;
  undefined8 local_488;
  undefined8 uStack_480;
  float local_448;
  undefined8 local_428;
  undefined8 uStack_420;
  float local_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float local_3c8;
  float fStack_3c4;
  float fStack_3c0;
  float fStack_3bc;
  float local_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  ulong local_390;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  undefined8 local_358;
  undefined8 uStack_350;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  undefined1 (*local_328) [16];
  Precalculations *local_320;
  RTCFilterFunctionNArguments local_318;
  undefined1 local_2e8 [16];
  ulong local_2d8;
  undefined4 uStack_2d0;
  undefined4 uStack_2cc;
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float fStack_2bc;
  undefined1 local_2b8 [8];
  float fStack_2b0;
  float fStack_2ac;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  LinearSpace3fa *local_238;
  Primitive *local_230;
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  uint local_1f8;
  int local_1f4;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined1 local_1a8 [16];
  float local_198 [4];
  undefined8 local_188;
  undefined8 uStack_180;
  float local_178 [4];
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  undefined4 local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  uint local_88;
  uint uStack_84;
  uint uStack_80;
  uint uStack_7c;
  uint local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  int local_58;
  int iStack_54;
  int iStack_50;
  int iStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 uVar103;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  
  PVar17 = prim[1];
  uVar54 = (ulong)(byte)PVar17;
  lVar22 = uVar54 * 0x25;
  pPVar7 = prim + lVar22 + 6;
  fVar147 = *(float *)(pPVar7 + 0xc);
  fVar150 = (*(float *)(ray + k * 4) - *(float *)pPVar7) * fVar147;
  fVar163 = (*(float *)(ray + k * 4 + 0x10) - *(float *)(pPVar7 + 4)) * fVar147;
  fVar166 = (*(float *)(ray + k * 4 + 0x20) - *(float *)(pPVar7 + 8)) * fVar147;
  fVar138 = *(float *)(ray + k * 4 + 0x40) * fVar147;
  fVar145 = *(float *)(ray + k * 4 + 0x50) * fVar147;
  fVar147 = *(float *)(ray + k * 4 + 0x60) * fVar147;
  uVar57 = *(undefined4 *)(prim + uVar54 * 4 + 6);
  uVar103 = (undefined1)((uint)uVar57 >> 0x18);
  uVar104 = CONCAT11(uVar103,uVar103);
  uVar103 = (undefined1)((uint)uVar57 >> 0x10);
  uVar107 = CONCAT35(CONCAT21(uVar104,uVar103),CONCAT14(uVar103,uVar57));
  uVar103 = (undefined1)((uint)uVar57 >> 8);
  uVar25 = CONCAT51(CONCAT41((int)((ulong)uVar107 >> 0x20),uVar103),uVar103);
  sVar72 = CONCAT11((char)uVar57,(char)uVar57);
  uVar64 = CONCAT62(uVar25,sVar72);
  auVar253._8_4_ = 0;
  auVar253._0_8_ = uVar64;
  auVar253._12_2_ = uVar104;
  auVar253._14_2_ = uVar104;
  uVar104 = (undefined2)((ulong)uVar107 >> 0x20);
  auVar141._12_4_ = auVar253._12_4_;
  auVar141._8_2_ = 0;
  auVar141._0_8_ = uVar64;
  auVar141._10_2_ = uVar104;
  auVar74._10_6_ = auVar141._10_6_;
  auVar74._8_2_ = uVar104;
  auVar74._0_8_ = uVar64;
  uVar104 = (undefined2)uVar25;
  auVar26._4_8_ = auVar74._8_8_;
  auVar26._2_2_ = uVar104;
  auVar26._0_2_ = uVar104;
  fVar299 = (float)((int)sVar72 >> 8);
  fVar305 = (float)(auVar26._0_4_ >> 0x18);
  fVar306 = (float)(auVar74._8_4_ >> 0x18);
  uVar57 = *(undefined4 *)(prim + uVar54 * 5 + 6);
  uVar103 = (undefined1)((uint)uVar57 >> 0x18);
  uVar104 = CONCAT11(uVar103,uVar103);
  uVar103 = (undefined1)((uint)uVar57 >> 0x10);
  uVar107 = CONCAT35(CONCAT21(uVar104,uVar103),CONCAT14(uVar103,uVar57));
  uVar103 = (undefined1)((uint)uVar57 >> 8);
  uVar25 = CONCAT51(CONCAT41((int)((ulong)uVar107 >> 0x20),uVar103),uVar103);
  sVar72 = CONCAT11((char)uVar57,(char)uVar57);
  uVar64 = CONCAT62(uVar25,sVar72);
  auVar113._8_4_ = 0;
  auVar113._0_8_ = uVar64;
  auVar113._12_2_ = uVar104;
  auVar113._14_2_ = uVar104;
  uVar104 = (undefined2)((ulong)uVar107 >> 0x20);
  auVar112._12_4_ = auVar113._12_4_;
  auVar112._8_2_ = 0;
  auVar112._0_8_ = uVar64;
  auVar112._10_2_ = uVar104;
  auVar111._10_6_ = auVar112._10_6_;
  auVar111._8_2_ = uVar104;
  auVar111._0_8_ = uVar64;
  uVar104 = (undefined2)uVar25;
  auVar27._4_8_ = auVar111._8_8_;
  auVar27._2_2_ = uVar104;
  auVar27._0_2_ = uVar104;
  fVar171 = (float)((int)sVar72 >> 8);
  fVar183 = (float)(auVar27._0_4_ >> 0x18);
  fVar185 = (float)(auVar111._8_4_ >> 0x18);
  uVar57 = *(undefined4 *)(prim + uVar54 * 6 + 6);
  uVar103 = (undefined1)((uint)uVar57 >> 0x18);
  uVar104 = CONCAT11(uVar103,uVar103);
  uVar103 = (undefined1)((uint)uVar57 >> 0x10);
  uVar107 = CONCAT35(CONCAT21(uVar104,uVar103),CONCAT14(uVar103,uVar57));
  uVar103 = (undefined1)((uint)uVar57 >> 8);
  uVar25 = CONCAT51(CONCAT41((int)((ulong)uVar107 >> 0x20),uVar103),uVar103);
  sVar72 = CONCAT11((char)uVar57,(char)uVar57);
  uVar64 = CONCAT62(uVar25,sVar72);
  auVar116._8_4_ = 0;
  auVar116._0_8_ = uVar64;
  auVar116._12_2_ = uVar104;
  auVar116._14_2_ = uVar104;
  uVar104 = (undefined2)((ulong)uVar107 >> 0x20);
  auVar115._12_4_ = auVar116._12_4_;
  auVar115._8_2_ = 0;
  auVar115._0_8_ = uVar64;
  auVar115._10_2_ = uVar104;
  auVar114._10_6_ = auVar115._10_6_;
  auVar114._8_2_ = uVar104;
  auVar114._0_8_ = uVar64;
  uVar104 = (undefined2)uVar25;
  auVar28._4_8_ = auVar114._8_8_;
  auVar28._2_2_ = uVar104;
  auVar28._0_2_ = uVar104;
  fVar216 = (float)((int)sVar72 >> 8);
  fVar222 = (float)(auVar28._0_4_ >> 0x18);
  fVar224 = (float)(auVar114._8_4_ >> 0x18);
  uVar57 = *(undefined4 *)(prim + uVar54 * 0xf + 6);
  uVar103 = (undefined1)((uint)uVar57 >> 0x18);
  uVar104 = CONCAT11(uVar103,uVar103);
  uVar103 = (undefined1)((uint)uVar57 >> 0x10);
  uVar107 = CONCAT35(CONCAT21(uVar104,uVar103),CONCAT14(uVar103,uVar57));
  uVar103 = (undefined1)((uint)uVar57 >> 8);
  uVar25 = CONCAT51(CONCAT41((int)((ulong)uVar107 >> 0x20),uVar103),uVar103);
  sVar72 = CONCAT11((char)uVar57,(char)uVar57);
  uVar64 = CONCAT62(uVar25,sVar72);
  auVar119._8_4_ = 0;
  auVar119._0_8_ = uVar64;
  auVar119._12_2_ = uVar104;
  auVar119._14_2_ = uVar104;
  uVar104 = (undefined2)((ulong)uVar107 >> 0x20);
  auVar118._12_4_ = auVar119._12_4_;
  auVar118._8_2_ = 0;
  auVar118._0_8_ = uVar64;
  auVar118._10_2_ = uVar104;
  auVar117._10_6_ = auVar118._10_6_;
  auVar117._8_2_ = uVar104;
  auVar117._0_8_ = uVar64;
  uVar104 = (undefined2)uVar25;
  auVar29._4_8_ = auVar117._8_8_;
  auVar29._2_2_ = uVar104;
  auVar29._0_2_ = uVar104;
  fVar73 = (float)((int)sVar72 >> 8);
  fVar105 = (float)(auVar29._0_4_ >> 0x18);
  fVar106 = (float)(auVar117._8_4_ >> 0x18);
  uVar57 = *(undefined4 *)(prim + (ulong)(byte)PVar17 * 0x10 + 6);
  uVar103 = (undefined1)((uint)uVar57 >> 0x18);
  uVar104 = CONCAT11(uVar103,uVar103);
  uVar103 = (undefined1)((uint)uVar57 >> 0x10);
  uVar107 = CONCAT35(CONCAT21(uVar104,uVar103),CONCAT14(uVar103,uVar57));
  uVar103 = (undefined1)((uint)uVar57 >> 8);
  uVar25 = CONCAT51(CONCAT41((int)((ulong)uVar107 >> 0x20),uVar103),uVar103);
  sVar72 = CONCAT11((char)uVar57,(char)uVar57);
  uVar64 = CONCAT62(uVar25,sVar72);
  auVar192._8_4_ = 0;
  auVar192._0_8_ = uVar64;
  auVar192._12_2_ = uVar104;
  auVar192._14_2_ = uVar104;
  uVar104 = (undefined2)((ulong)uVar107 >> 0x20);
  auVar191._12_4_ = auVar192._12_4_;
  auVar191._8_2_ = 0;
  auVar191._0_8_ = uVar64;
  auVar191._10_2_ = uVar104;
  auVar190._10_6_ = auVar191._10_6_;
  auVar190._8_2_ = uVar104;
  auVar190._0_8_ = uVar64;
  uVar104 = (undefined2)uVar25;
  auVar30._4_8_ = auVar190._8_8_;
  auVar30._2_2_ = uVar104;
  auVar30._0_2_ = uVar104;
  fVar227 = (float)((int)sVar72 >> 8);
  fVar235 = (float)(auVar30._0_4_ >> 0x18);
  fVar238 = (float)(auVar190._8_4_ >> 0x18);
  uVar57 = *(undefined4 *)(prim + (ulong)(byte)PVar17 * 0x10 + uVar54 + 6);
  uVar103 = (undefined1)((uint)uVar57 >> 0x18);
  uVar104 = CONCAT11(uVar103,uVar103);
  uVar103 = (undefined1)((uint)uVar57 >> 0x10);
  uVar107 = CONCAT35(CONCAT21(uVar104,uVar103),CONCAT14(uVar103,uVar57));
  uVar103 = (undefined1)((uint)uVar57 >> 8);
  uVar25 = CONCAT51(CONCAT41((int)((ulong)uVar107 >> 0x20),uVar103),uVar103);
  sVar72 = CONCAT11((char)uVar57,(char)uVar57);
  uVar64 = CONCAT62(uVar25,sVar72);
  auVar195._8_4_ = 0;
  auVar195._0_8_ = uVar64;
  auVar195._12_2_ = uVar104;
  auVar195._14_2_ = uVar104;
  uVar104 = (undefined2)((ulong)uVar107 >> 0x20);
  auVar194._12_4_ = auVar195._12_4_;
  auVar194._8_2_ = 0;
  auVar194._0_8_ = uVar64;
  auVar194._10_2_ = uVar104;
  auVar193._10_6_ = auVar194._10_6_;
  auVar193._8_2_ = uVar104;
  auVar193._0_8_ = uVar64;
  uVar104 = (undefined2)uVar25;
  auVar31._4_8_ = auVar193._8_8_;
  auVar31._2_2_ = uVar104;
  auVar31._0_2_ = uVar104;
  fVar248 = (float)((int)sVar72 >> 8);
  fVar255 = (float)(auVar31._0_4_ >> 0x18);
  fVar256 = (float)(auVar193._8_4_ >> 0x18);
  uVar57 = *(undefined4 *)(prim + uVar54 * 0x1a + 6);
  uVar103 = (undefined1)((uint)uVar57 >> 0x18);
  uVar104 = CONCAT11(uVar103,uVar103);
  uVar103 = (undefined1)((uint)uVar57 >> 0x10);
  uVar107 = CONCAT35(CONCAT21(uVar104,uVar103),CONCAT14(uVar103,uVar57));
  uVar103 = (undefined1)((uint)uVar57 >> 8);
  uVar25 = CONCAT51(CONCAT41((int)((ulong)uVar107 >> 0x20),uVar103),uVar103);
  sVar72 = CONCAT11((char)uVar57,(char)uVar57);
  uVar64 = CONCAT62(uVar25,sVar72);
  auVar198._8_4_ = 0;
  auVar198._0_8_ = uVar64;
  auVar198._12_2_ = uVar104;
  auVar198._14_2_ = uVar104;
  uVar104 = (undefined2)((ulong)uVar107 >> 0x20);
  auVar197._12_4_ = auVar198._12_4_;
  auVar197._8_2_ = 0;
  auVar197._0_8_ = uVar64;
  auVar197._10_2_ = uVar104;
  auVar196._10_6_ = auVar197._10_6_;
  auVar196._8_2_ = uVar104;
  auVar196._0_8_ = uVar64;
  uVar104 = (undefined2)uVar25;
  auVar32._4_8_ = auVar196._8_8_;
  auVar32._2_2_ = uVar104;
  auVar32._0_2_ = uVar104;
  fVar243 = (float)((int)sVar72 >> 8);
  fVar246 = (float)(auVar32._0_4_ >> 0x18);
  fVar247 = (float)(auVar196._8_4_ >> 0x18);
  uVar57 = *(undefined4 *)(prim + uVar54 * 0x1b + 6);
  uVar103 = (undefined1)((uint)uVar57 >> 0x18);
  uVar104 = CONCAT11(uVar103,uVar103);
  uVar103 = (undefined1)((uint)uVar57 >> 0x10);
  uVar107 = CONCAT35(CONCAT21(uVar104,uVar103),CONCAT14(uVar103,uVar57));
  uVar103 = (undefined1)((uint)uVar57 >> 8);
  uVar25 = CONCAT51(CONCAT41((int)((ulong)uVar107 >> 0x20),uVar103),uVar103);
  sVar72 = CONCAT11((char)uVar57,(char)uVar57);
  uVar64 = CONCAT62(uVar25,sVar72);
  auVar201._8_4_ = 0;
  auVar201._0_8_ = uVar64;
  auVar201._12_2_ = uVar104;
  auVar201._14_2_ = uVar104;
  uVar104 = (undefined2)((ulong)uVar107 >> 0x20);
  auVar200._12_4_ = auVar201._12_4_;
  auVar200._8_2_ = 0;
  auVar200._0_8_ = uVar64;
  auVar200._10_2_ = uVar104;
  auVar199._10_6_ = auVar200._10_6_;
  auVar199._8_2_ = uVar104;
  auVar199._0_8_ = uVar64;
  uVar104 = (undefined2)uVar25;
  auVar33._4_8_ = auVar199._8_8_;
  auVar33._2_2_ = uVar104;
  auVar33._0_2_ = uVar104;
  fVar257 = (float)((int)sVar72 >> 8);
  fVar266 = (float)(auVar33._0_4_ >> 0x18);
  fVar269 = (float)(auVar199._8_4_ >> 0x18);
  uVar57 = *(undefined4 *)(prim + uVar54 * 0x1c + 6);
  uVar103 = (undefined1)((uint)uVar57 >> 0x18);
  uVar104 = CONCAT11(uVar103,uVar103);
  uVar103 = (undefined1)((uint)uVar57 >> 0x10);
  uVar107 = CONCAT35(CONCAT21(uVar104,uVar103),CONCAT14(uVar103,uVar57));
  uVar103 = (undefined1)((uint)uVar57 >> 8);
  uVar25 = CONCAT51(CONCAT41((int)((ulong)uVar107 >> 0x20),uVar103),uVar103);
  sVar72 = CONCAT11((char)uVar57,(char)uVar57);
  uVar64 = CONCAT62(uVar25,sVar72);
  auVar204._8_4_ = 0;
  auVar204._0_8_ = uVar64;
  auVar204._12_2_ = uVar104;
  auVar204._14_2_ = uVar104;
  uVar104 = (undefined2)((ulong)uVar107 >> 0x20);
  auVar203._12_4_ = auVar204._12_4_;
  auVar203._8_2_ = 0;
  auVar203._0_8_ = uVar64;
  auVar203._10_2_ = uVar104;
  auVar202._10_6_ = auVar203._10_6_;
  auVar202._8_2_ = uVar104;
  auVar202._0_8_ = uVar64;
  uVar104 = (undefined2)uVar25;
  auVar34._4_8_ = auVar202._8_8_;
  auVar34._2_2_ = uVar104;
  auVar34._0_2_ = uVar104;
  fVar108 = (float)((int)sVar72 >> 8);
  fVar130 = (float)(auVar34._0_4_ >> 0x18);
  fVar133 = (float)(auVar202._8_4_ >> 0x18);
  fVar284 = fVar138 * fVar299 + fVar145 * fVar171 + fVar147 * fVar216;
  fVar293 = fVar138 * fVar305 + fVar145 * fVar183 + fVar147 * fVar222;
  fVar295 = fVar138 * fVar306 + fVar145 * fVar185 + fVar147 * fVar224;
  fVar297 = fVar138 * (float)(auVar141._12_4_ >> 0x18) +
            fVar145 * (float)(auVar112._12_4_ >> 0x18) + fVar147 * (float)(auVar115._12_4_ >> 0x18);
  fVar274 = fVar138 * fVar73 + fVar145 * fVar227 + fVar147 * fVar248;
  fVar281 = fVar138 * fVar105 + fVar145 * fVar235 + fVar147 * fVar255;
  fVar282 = fVar138 * fVar106 + fVar145 * fVar238 + fVar147 * fVar256;
  fVar283 = fVar138 * (float)(auVar118._12_4_ >> 0x18) +
            fVar145 * (float)(auVar191._12_4_ >> 0x18) + fVar147 * (float)(auVar194._12_4_ >> 0x18);
  fVar188 = fVar138 * fVar243 + fVar145 * fVar257 + fVar147 * fVar108;
  fVar211 = fVar138 * fVar246 + fVar145 * fVar266 + fVar147 * fVar130;
  fVar213 = fVar138 * fVar247 + fVar145 * fVar269 + fVar147 * fVar133;
  fVar138 = fVar138 * (float)(auVar197._12_4_ >> 0x18) +
            fVar145 * (float)(auVar200._12_4_ >> 0x18) + fVar147 * (float)(auVar203._12_4_ >> 0x18);
  fVar300 = fVar299 * fVar150 + fVar171 * fVar163 + fVar216 * fVar166;
  fVar305 = fVar305 * fVar150 + fVar183 * fVar163 + fVar222 * fVar166;
  fVar306 = fVar306 * fVar150 + fVar185 * fVar163 + fVar224 * fVar166;
  fVar307 = (float)(auVar141._12_4_ >> 0x18) * fVar150 +
            (float)(auVar112._12_4_ >> 0x18) * fVar163 + (float)(auVar115._12_4_ >> 0x18) * fVar166;
  fVar248 = fVar73 * fVar150 + fVar227 * fVar163 + fVar248 * fVar166;
  fVar255 = fVar105 * fVar150 + fVar235 * fVar163 + fVar255 * fVar166;
  fVar256 = fVar106 * fVar150 + fVar238 * fVar163 + fVar256 * fVar166;
  fVar299 = (float)(auVar118._12_4_ >> 0x18) * fVar150 +
            (float)(auVar191._12_4_ >> 0x18) * fVar163 + (float)(auVar194._12_4_ >> 0x18) * fVar166;
  fVar243 = fVar150 * fVar243 + fVar163 * fVar257 + fVar166 * fVar108;
  fVar246 = fVar150 * fVar246 + fVar163 * fVar266 + fVar166 * fVar130;
  fVar247 = fVar150 * fVar247 + fVar163 * fVar269 + fVar166 * fVar133;
  fVar257 = fVar150 * (float)(auVar197._12_4_ >> 0x18) +
            fVar163 * (float)(auVar200._12_4_ >> 0x18) + fVar166 * (float)(auVar203._12_4_ >> 0x18);
  fVar147 = (float)DAT_01ff1d40;
  fVar73 = DAT_01ff1d40._4_4_;
  fVar105 = DAT_01ff1d40._8_4_;
  fVar106 = DAT_01ff1d40._12_4_;
  uVar66 = -(uint)(fVar147 <= ABS(fVar284));
  uVar67 = -(uint)(fVar73 <= ABS(fVar293));
  uVar68 = -(uint)(fVar105 <= ABS(fVar295));
  uVar69 = -(uint)(fVar106 <= ABS(fVar297));
  auVar286._0_4_ = (uint)fVar284 & uVar66;
  auVar286._4_4_ = (uint)fVar293 & uVar67;
  auVar286._8_4_ = (uint)fVar295 & uVar68;
  auVar286._12_4_ = (uint)fVar297 & uVar69;
  auVar152._0_4_ = ~uVar66 & (uint)fVar147;
  auVar152._4_4_ = ~uVar67 & (uint)fVar73;
  auVar152._8_4_ = ~uVar68 & (uint)fVar105;
  auVar152._12_4_ = ~uVar69 & (uint)fVar106;
  auVar152 = auVar152 | auVar286;
  uVar66 = -(uint)(fVar147 <= ABS(fVar274));
  uVar67 = -(uint)(fVar73 <= ABS(fVar281));
  uVar68 = -(uint)(fVar105 <= ABS(fVar282));
  uVar69 = -(uint)(fVar106 <= ABS(fVar283));
  auVar275._0_4_ = (uint)fVar274 & uVar66;
  auVar275._4_4_ = (uint)fVar281 & uVar67;
  auVar275._8_4_ = (uint)fVar282 & uVar68;
  auVar275._12_4_ = (uint)fVar283 & uVar69;
  auVar218._0_4_ = ~uVar66 & (uint)fVar147;
  auVar218._4_4_ = ~uVar67 & (uint)fVar73;
  auVar218._8_4_ = ~uVar68 & (uint)fVar105;
  auVar218._12_4_ = ~uVar69 & (uint)fVar106;
  auVar218 = auVar218 | auVar275;
  uVar66 = -(uint)(fVar147 <= ABS(fVar188));
  uVar67 = -(uint)(fVar73 <= ABS(fVar211));
  uVar68 = -(uint)(fVar105 <= ABS(fVar213));
  uVar69 = -(uint)(fVar106 <= ABS(fVar138));
  auVar205._0_4_ = (uint)fVar188 & uVar66;
  auVar205._4_4_ = (uint)fVar211 & uVar67;
  auVar205._8_4_ = (uint)fVar213 & uVar68;
  auVar205._12_4_ = (uint)fVar138 & uVar69;
  auVar230._0_4_ = ~uVar66 & (uint)fVar147;
  auVar230._4_4_ = ~uVar67 & (uint)fVar73;
  auVar230._8_4_ = ~uVar68 & (uint)fVar105;
  auVar230._12_4_ = ~uVar69 & (uint)fVar106;
  auVar230 = auVar230 | auVar205;
  auVar74 = rcpps(_DAT_01ff1d40,auVar152);
  fVar147 = auVar74._0_4_;
  fVar106 = auVar74._4_4_;
  fVar171 = auVar74._8_4_;
  fVar227 = auVar74._12_4_;
  fVar147 = (1.0 - auVar152._0_4_ * fVar147) * fVar147 + fVar147;
  fVar106 = (1.0 - auVar152._4_4_ * fVar106) * fVar106 + fVar106;
  fVar171 = (1.0 - auVar152._8_4_ * fVar171) * fVar171 + fVar171;
  fVar227 = (1.0 - auVar152._12_4_ * fVar227) * fVar227 + fVar227;
  auVar74 = rcpps(auVar74,auVar218);
  fVar73 = auVar74._0_4_;
  fVar108 = auVar74._4_4_;
  fVar183 = auVar74._8_4_;
  fVar235 = auVar74._12_4_;
  fVar73 = (1.0 - auVar218._0_4_ * fVar73) * fVar73 + fVar73;
  fVar108 = (1.0 - auVar218._4_4_ * fVar108) * fVar108 + fVar108;
  fVar183 = (1.0 - auVar218._8_4_ * fVar183) * fVar183 + fVar183;
  fVar235 = (1.0 - auVar218._12_4_ * fVar235) * fVar235 + fVar235;
  auVar74 = rcpps(auVar74,auVar230);
  fVar105 = auVar74._0_4_;
  fVar130 = auVar74._4_4_;
  fVar185 = auVar74._8_4_;
  fVar238 = auVar74._12_4_;
  fVar105 = (1.0 - auVar230._0_4_ * fVar105) * fVar105 + fVar105;
  fVar130 = (1.0 - auVar230._4_4_ * fVar130) * fVar130 + fVar130;
  fVar185 = (1.0 - auVar230._8_4_ * fVar185) * fVar185 + fVar185;
  fVar238 = (1.0 - auVar230._12_4_ * fVar238) * fVar238 + fVar238;
  fVar266 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar22 + 0x16)) *
            *(float *)(prim + lVar22 + 0x1a);
  uVar64 = *(ulong *)(prim + uVar54 * 7 + 6);
  uVar104 = (undefined2)(uVar64 >> 0x30);
  auVar77._8_4_ = 0;
  auVar77._0_8_ = uVar64;
  auVar77._12_2_ = uVar104;
  auVar77._14_2_ = uVar104;
  uVar104 = (undefined2)(uVar64 >> 0x20);
  auVar76._12_4_ = auVar77._12_4_;
  auVar76._8_2_ = 0;
  auVar76._0_8_ = uVar64;
  auVar76._10_2_ = uVar104;
  auVar75._10_6_ = auVar76._10_6_;
  auVar75._8_2_ = uVar104;
  auVar75._0_8_ = uVar64;
  uVar104 = (undefined2)(uVar64 >> 0x10);
  auVar35._4_8_ = auVar75._8_8_;
  auVar35._2_2_ = uVar104;
  auVar35._0_2_ = uVar104;
  fVar133 = (float)(auVar35._0_4_ >> 0x10);
  fVar188 = (float)(auVar75._8_4_ >> 0x10);
  uVar63 = *(ulong *)(prim + uVar54 * 0xb + 6);
  uVar104 = (undefined2)(uVar63 >> 0x30);
  auVar155._8_4_ = 0;
  auVar155._0_8_ = uVar63;
  auVar155._12_2_ = uVar104;
  auVar155._14_2_ = uVar104;
  uVar104 = (undefined2)(uVar63 >> 0x20);
  auVar154._12_4_ = auVar155._12_4_;
  auVar154._8_2_ = 0;
  auVar154._0_8_ = uVar63;
  auVar154._10_2_ = uVar104;
  auVar153._10_6_ = auVar154._10_6_;
  auVar153._8_2_ = uVar104;
  auVar153._0_8_ = uVar63;
  uVar104 = (undefined2)(uVar63 >> 0x10);
  auVar36._4_8_ = auVar153._8_8_;
  auVar36._2_2_ = uVar104;
  auVar36._0_2_ = uVar104;
  uVar9 = *(ulong *)(prim + uVar54 * 9 + 6);
  uVar104 = (undefined2)(uVar9 >> 0x30);
  auVar80._8_4_ = 0;
  auVar80._0_8_ = uVar9;
  auVar80._12_2_ = uVar104;
  auVar80._14_2_ = uVar104;
  uVar104 = (undefined2)(uVar9 >> 0x20);
  auVar79._12_4_ = auVar80._12_4_;
  auVar79._8_2_ = 0;
  auVar79._0_8_ = uVar9;
  auVar79._10_2_ = uVar104;
  auVar78._10_6_ = auVar79._10_6_;
  auVar78._8_2_ = uVar104;
  auVar78._0_8_ = uVar9;
  uVar104 = (undefined2)(uVar9 >> 0x10);
  auVar37._4_8_ = auVar78._8_8_;
  auVar37._2_2_ = uVar104;
  auVar37._0_2_ = uVar104;
  fVar138 = (float)(auVar37._0_4_ >> 0x10);
  fVar211 = (float)(auVar78._8_4_ >> 0x10);
  uVar10 = *(ulong *)(prim + uVar54 * 0xd + 6);
  uVar104 = (undefined2)(uVar10 >> 0x30);
  auVar233._8_4_ = 0;
  auVar233._0_8_ = uVar10;
  auVar233._12_2_ = uVar104;
  auVar233._14_2_ = uVar104;
  uVar104 = (undefined2)(uVar10 >> 0x20);
  auVar232._12_4_ = auVar233._12_4_;
  auVar232._8_2_ = 0;
  auVar232._0_8_ = uVar10;
  auVar232._10_2_ = uVar104;
  auVar231._10_6_ = auVar232._10_6_;
  auVar231._8_2_ = uVar104;
  auVar231._0_8_ = uVar10;
  uVar104 = (undefined2)(uVar10 >> 0x10);
  auVar38._4_8_ = auVar231._8_8_;
  auVar38._2_2_ = uVar104;
  auVar38._0_2_ = uVar104;
  uVar11 = *(ulong *)(prim + uVar54 * 0x12 + 6);
  uVar104 = (undefined2)(uVar11 >> 0x30);
  auVar83._8_4_ = 0;
  auVar83._0_8_ = uVar11;
  auVar83._12_2_ = uVar104;
  auVar83._14_2_ = uVar104;
  uVar104 = (undefined2)(uVar11 >> 0x20);
  auVar82._12_4_ = auVar83._12_4_;
  auVar82._8_2_ = 0;
  auVar82._0_8_ = uVar11;
  auVar82._10_2_ = uVar104;
  auVar81._10_6_ = auVar82._10_6_;
  auVar81._8_2_ = uVar104;
  auVar81._0_8_ = uVar11;
  uVar104 = (undefined2)(uVar11 >> 0x10);
  auVar39._4_8_ = auVar81._8_8_;
  auVar39._2_2_ = uVar104;
  auVar39._0_2_ = uVar104;
  fVar145 = (float)(auVar39._0_4_ >> 0x10);
  fVar213 = (float)(auVar81._8_4_ >> 0x10);
  uVar60 = (ulong)(uint)((int)(uVar54 * 5) << 2);
  uVar12 = *(ulong *)(prim + uVar54 * 2 + uVar60 + 6);
  uVar104 = (undefined2)(uVar12 >> 0x30);
  auVar251._8_4_ = 0;
  auVar251._0_8_ = uVar12;
  auVar251._12_2_ = uVar104;
  auVar251._14_2_ = uVar104;
  uVar104 = (undefined2)(uVar12 >> 0x20);
  auVar250._12_4_ = auVar251._12_4_;
  auVar250._8_2_ = 0;
  auVar250._0_8_ = uVar12;
  auVar250._10_2_ = uVar104;
  auVar249._10_6_ = auVar250._10_6_;
  auVar249._8_2_ = uVar104;
  auVar249._0_8_ = uVar12;
  uVar104 = (undefined2)(uVar12 >> 0x10);
  auVar40._4_8_ = auVar249._8_8_;
  auVar40._2_2_ = uVar104;
  auVar40._0_2_ = uVar104;
  uVar60 = *(ulong *)(prim + uVar60 + 6);
  uVar104 = (undefined2)(uVar60 >> 0x30);
  auVar86._8_4_ = 0;
  auVar86._0_8_ = uVar60;
  auVar86._12_2_ = uVar104;
  auVar86._14_2_ = uVar104;
  uVar104 = (undefined2)(uVar60 >> 0x20);
  auVar85._12_4_ = auVar86._12_4_;
  auVar85._8_2_ = 0;
  auVar85._0_8_ = uVar60;
  auVar85._10_2_ = uVar104;
  auVar84._10_6_ = auVar85._10_6_;
  auVar84._8_2_ = uVar104;
  auVar84._0_8_ = uVar60;
  uVar104 = (undefined2)(uVar60 >> 0x10);
  auVar41._4_8_ = auVar84._8_8_;
  auVar41._2_2_ = uVar104;
  auVar41._0_2_ = uVar104;
  fVar150 = (float)(auVar41._0_4_ >> 0x10);
  fVar216 = (float)(auVar84._8_4_ >> 0x10);
  uVar13 = *(ulong *)(prim + uVar54 * 0x18 + 6);
  uVar104 = (undefined2)(uVar13 >> 0x30);
  auVar261._8_4_ = 0;
  auVar261._0_8_ = uVar13;
  auVar261._12_2_ = uVar104;
  auVar261._14_2_ = uVar104;
  uVar104 = (undefined2)(uVar13 >> 0x20);
  auVar260._12_4_ = auVar261._12_4_;
  auVar260._8_2_ = 0;
  auVar260._0_8_ = uVar13;
  auVar260._10_2_ = uVar104;
  auVar259._10_6_ = auVar260._10_6_;
  auVar259._8_2_ = uVar104;
  auVar259._0_8_ = uVar13;
  uVar104 = (undefined2)(uVar13 >> 0x10);
  auVar42._4_8_ = auVar259._8_8_;
  auVar42._2_2_ = uVar104;
  auVar42._0_2_ = uVar104;
  uVar14 = *(ulong *)(prim + uVar54 * 0x1d + 6);
  uVar104 = (undefined2)(uVar14 >> 0x30);
  auVar89._8_4_ = 0;
  auVar89._0_8_ = uVar14;
  auVar89._12_2_ = uVar104;
  auVar89._14_2_ = uVar104;
  uVar104 = (undefined2)(uVar14 >> 0x20);
  auVar88._12_4_ = auVar89._12_4_;
  auVar88._8_2_ = 0;
  auVar88._0_8_ = uVar14;
  auVar88._10_2_ = uVar104;
  auVar87._10_6_ = auVar88._10_6_;
  auVar87._8_2_ = uVar104;
  auVar87._0_8_ = uVar14;
  uVar104 = (undefined2)(uVar14 >> 0x10);
  auVar43._4_8_ = auVar87._8_8_;
  auVar43._2_2_ = uVar104;
  auVar43._0_2_ = uVar104;
  fVar163 = (float)(auVar43._0_4_ >> 0x10);
  fVar222 = (float)(auVar87._8_4_ >> 0x10);
  uVar15 = *(ulong *)(prim + uVar54 + (ulong)(byte)PVar17 * 0x20 + 6);
  uVar104 = (undefined2)(uVar15 >> 0x30);
  auVar278._8_4_ = 0;
  auVar278._0_8_ = uVar15;
  auVar278._12_2_ = uVar104;
  auVar278._14_2_ = uVar104;
  uVar104 = (undefined2)(uVar15 >> 0x20);
  auVar277._12_4_ = auVar278._12_4_;
  auVar277._8_2_ = 0;
  auVar277._0_8_ = uVar15;
  auVar277._10_2_ = uVar104;
  auVar276._10_6_ = auVar277._10_6_;
  auVar276._8_2_ = uVar104;
  auVar276._0_8_ = uVar15;
  uVar104 = (undefined2)(uVar15 >> 0x10);
  auVar44._4_8_ = auVar276._8_8_;
  auVar44._2_2_ = uVar104;
  auVar44._0_2_ = uVar104;
  uVar16 = *(ulong *)(prim + ((ulong)(byte)PVar17 * 0x20 - uVar54) + 6);
  uVar104 = (undefined2)(uVar16 >> 0x30);
  auVar92._8_4_ = 0;
  auVar92._0_8_ = uVar16;
  auVar92._12_2_ = uVar104;
  auVar92._14_2_ = uVar104;
  uVar104 = (undefined2)(uVar16 >> 0x20);
  auVar91._12_4_ = auVar92._12_4_;
  auVar91._8_2_ = 0;
  auVar91._0_8_ = uVar16;
  auVar91._10_2_ = uVar104;
  auVar90._10_6_ = auVar91._10_6_;
  auVar90._8_2_ = uVar104;
  auVar90._0_8_ = uVar16;
  uVar104 = (undefined2)(uVar16 >> 0x10);
  auVar45._4_8_ = auVar90._8_8_;
  auVar45._2_2_ = uVar104;
  auVar45._0_2_ = uVar104;
  fVar166 = (float)(auVar45._0_4_ >> 0x10);
  fVar224 = (float)(auVar90._8_4_ >> 0x10);
  uVar54 = *(ulong *)(prim + uVar54 * 0x23 + 6);
  uVar104 = (undefined2)(uVar54 >> 0x30);
  auVar289._8_4_ = 0;
  auVar289._0_8_ = uVar54;
  auVar289._12_2_ = uVar104;
  auVar289._14_2_ = uVar104;
  uVar104 = (undefined2)(uVar54 >> 0x20);
  auVar288._12_4_ = auVar289._12_4_;
  auVar288._8_2_ = 0;
  auVar288._0_8_ = uVar54;
  auVar288._10_2_ = uVar104;
  auVar287._10_6_ = auVar288._10_6_;
  auVar287._8_2_ = uVar104;
  auVar287._0_8_ = uVar54;
  uVar104 = (undefined2)(uVar54 >> 0x10);
  auVar46._4_8_ = auVar287._8_8_;
  auVar46._2_2_ = uVar104;
  auVar46._0_2_ = uVar104;
  auVar156._0_8_ =
       CONCAT44(((((float)(auVar36._0_4_ >> 0x10) - fVar133) * fVar266 + fVar133) - fVar305) *
                fVar106,((((float)(int)(short)uVar63 - (float)(int)(short)uVar64) * fVar266 +
                         (float)(int)(short)uVar64) - fVar300) * fVar147);
  auVar156._8_4_ =
       ((((float)(auVar153._8_4_ >> 0x10) - fVar188) * fVar266 + fVar188) - fVar306) * fVar171;
  auVar156._12_4_ =
       ((((float)(auVar154._12_4_ >> 0x10) - (float)(auVar76._12_4_ >> 0x10)) * fVar266 +
        (float)(auVar76._12_4_ >> 0x10)) - fVar307) * fVar227;
  auVar234._0_4_ =
       ((((float)(int)(short)uVar10 - (float)(int)(short)uVar9) * fVar266 + (float)(int)(short)uVar9
        ) - fVar300) * fVar147;
  auVar234._4_4_ =
       ((((float)(auVar38._0_4_ >> 0x10) - fVar138) * fVar266 + fVar138) - fVar305) * fVar106;
  auVar234._8_4_ =
       ((((float)(auVar231._8_4_ >> 0x10) - fVar211) * fVar266 + fVar211) - fVar306) * fVar171;
  auVar234._12_4_ =
       ((((float)(auVar232._12_4_ >> 0x10) - (float)(auVar79._12_4_ >> 0x10)) * fVar266 +
        (float)(auVar79._12_4_ >> 0x10)) - fVar307) * fVar227;
  auVar252._0_8_ =
       CONCAT44(((((float)(auVar40._0_4_ >> 0x10) - fVar145) * fVar266 + fVar145) - fVar255) *
                fVar108,((((float)(int)(short)uVar12 - (float)(int)(short)uVar11) * fVar266 +
                         (float)(int)(short)uVar11) - fVar248) * fVar73);
  auVar252._8_4_ =
       ((((float)(auVar249._8_4_ >> 0x10) - fVar213) * fVar266 + fVar213) - fVar256) * fVar183;
  auVar252._12_4_ =
       ((((float)(auVar250._12_4_ >> 0x10) - (float)(auVar82._12_4_ >> 0x10)) * fVar266 +
        (float)(auVar82._12_4_ >> 0x10)) - fVar299) * fVar235;
  auVar262._0_4_ =
       ((((float)(int)(short)uVar13 - (float)(int)(short)uVar60) * fVar266 +
        (float)(int)(short)uVar60) - fVar248) * fVar73;
  auVar262._4_4_ =
       ((((float)(auVar42._0_4_ >> 0x10) - fVar150) * fVar266 + fVar150) - fVar255) * fVar108;
  auVar262._8_4_ =
       ((((float)(auVar259._8_4_ >> 0x10) - fVar216) * fVar266 + fVar216) - fVar256) * fVar183;
  auVar262._12_4_ =
       ((((float)(auVar260._12_4_ >> 0x10) - (float)(auVar85._12_4_ >> 0x10)) * fVar266 +
        (float)(auVar85._12_4_ >> 0x10)) - fVar299) * fVar235;
  uVar57 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar279._0_8_ =
       CONCAT44(((((float)(auVar44._0_4_ >> 0x10) - fVar163) * fVar266 + fVar163) - fVar246) *
                fVar130,((((float)(int)(short)uVar15 - (float)(int)(short)uVar14) * fVar266 +
                         (float)(int)(short)uVar14) - fVar243) * fVar105);
  auVar279._8_4_ =
       ((((float)(auVar276._8_4_ >> 0x10) - fVar222) * fVar266 + fVar222) - fVar247) * fVar185;
  auVar279._12_4_ =
       ((((float)(auVar277._12_4_ >> 0x10) - (float)(auVar88._12_4_ >> 0x10)) * fVar266 +
        (float)(auVar88._12_4_ >> 0x10)) - fVar257) * fVar238;
  auVar290._0_4_ =
       ((((float)(int)(short)uVar54 - (float)(int)(short)uVar16) * fVar266 +
        (float)(int)(short)uVar16) - fVar243) * fVar105;
  auVar290._4_4_ =
       ((((float)(auVar46._0_4_ >> 0x10) - fVar166) * fVar266 + fVar166) - fVar246) * fVar130;
  auVar290._8_4_ =
       ((((float)(auVar287._8_4_ >> 0x10) - fVar224) * fVar266 + fVar224) - fVar247) * fVar185;
  auVar290._12_4_ =
       ((((float)(auVar288._12_4_ >> 0x10) - (float)(auVar91._12_4_ >> 0x10)) * fVar266 +
        (float)(auVar91._12_4_ >> 0x10)) - fVar257) * fVar238;
  auVar140._8_4_ = auVar156._8_4_;
  auVar140._0_8_ = auVar156._0_8_;
  auVar140._12_4_ = auVar156._12_4_;
  auVar141 = minps(auVar140,auVar234);
  auVar120._8_4_ = auVar252._8_4_;
  auVar120._0_8_ = auVar252._0_8_;
  auVar120._12_4_ = auVar252._12_4_;
  auVar74 = minps(auVar120,auVar262);
  auVar141 = maxps(auVar141,auVar74);
  auVar121._8_4_ = auVar279._8_4_;
  auVar121._0_8_ = auVar279._0_8_;
  auVar121._12_4_ = auVar279._12_4_;
  auVar74 = minps(auVar121,auVar290);
  auVar93._4_4_ = uVar57;
  auVar93._0_4_ = uVar57;
  auVar93._8_4_ = uVar57;
  auVar93._12_4_ = uVar57;
  auVar74 = maxps(auVar74,auVar93);
  auVar74 = maxps(auVar141,auVar74);
  auVar141 = maxps(auVar156,auVar234);
  auVar253 = maxps(auVar252,auVar262);
  auVar141 = minps(auVar141,auVar253);
  auVar253 = maxps(auVar279,auVar290);
  uVar57 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar94._4_4_ = uVar57;
  auVar94._0_4_ = uVar57;
  auVar94._8_4_ = uVar57;
  auVar94._12_4_ = uVar57;
  auVar253 = minps(auVar253,auVar94);
  local_48 = auVar74._0_4_ * 0.99999964;
  fStack_44 = auVar74._4_4_ * 0.99999964;
  fStack_40 = auVar74._8_4_ * 0.99999964;
  fStack_3c = auVar74._12_4_ * 0.99999964;
  auVar74 = minps(auVar141,auVar253);
  uVar66 = (uint)(byte)PVar17;
  auVar95._0_4_ = -(uint)(local_48 <= auVar74._0_4_ * 1.0000004 && uVar66 != 0);
  auVar95._4_4_ = -(uint)(fStack_44 <= auVar74._4_4_ * 1.0000004 && 1 < uVar66);
  auVar95._8_4_ = -(uint)(fStack_40 <= auVar74._8_4_ * 1.0000004 && 2 < uVar66);
  auVar95._12_4_ = -(uint)(fStack_3c <= auVar74._12_4_ * 1.0000004 && 3 < uVar66);
  uVar66 = movmskps(uVar66,auVar95);
  local_4e9 = uVar66 != 0;
  if (local_4e9) {
    uVar66 = uVar66 & 0xff;
    local_238 = pre->ray_space + k;
    local_358 = mm_lookupmask_ps._0_8_;
    uStack_350 = mm_lookupmask_ps._8_8_;
    local_328 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
    local_320 = pre;
    local_230 = prim;
    do {
      lVar22 = 0;
      if (uVar66 != 0) {
        for (; (uVar66 >> lVar22 & 1) == 0; lVar22 = lVar22 + 1) {
        }
      }
      local_390 = (ulong)*(uint *)(local_230 + 2);
      local_2d8 = (ulong)*(uint *)(local_230 + lVar22 * 4 + 6);
      pGVar19 = (context->scene->geometries).items[local_390].ptr;
      uVar64 = (ulong)*(uint *)(*(long *)&pGVar19->field_0x58 +
                               local_2d8 *
                               pGVar19[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      fVar147 = pGVar19->fnumTimeSegments;
      fVar73 = (pGVar19->time_range).lower;
      fVar105 = ((*(float *)(ray + k * 4 + 0x70) - fVar73) / ((pGVar19->time_range).upper - fVar73))
                * fVar147;
      fVar73 = floorf(fVar105);
      fVar147 = fVar147 + -1.0;
      if (fVar147 <= fVar73) {
        fVar73 = fVar147;
      }
      fVar147 = 0.0;
      if (0.0 <= fVar73) {
        fVar147 = fVar73;
      }
      _Var20 = pGVar19[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      pGVar61 = (Geometry *)((long)(int)fVar147 * 0x38);
      lVar22 = *(long *)((long)&pGVar61->device + _Var20);
      lVar62 = *(long *)((long)&pGVar61->modCounter_ + _Var20);
      lVar21 = *(long *)((long)&pGVar61->occlusionFilterN + _Var20);
      pfVar1 = (float *)(lVar62 + uVar64 * lVar21);
      pfVar2 = (float *)(lVar62 + (uVar64 + 1) * lVar21);
      pfVar3 = (float *)(lVar62 + (uVar64 + 2) * lVar21);
      fVar105 = fVar105 - fVar147;
      fVar147 = 1.0 - fVar105;
      pfVar4 = (float *)(lVar62 + lVar21 * (uVar64 + 3));
      lVar62 = *(long *)((long)&(pGVar61->super_RefCount)._vptr_RefCount + _Var20);
      pfVar5 = (float *)(lVar62 + lVar22 * uVar64);
      pfVar6 = (float *)(lVar62 + lVar22 * (uVar64 + 1));
      local_2c8 = *pfVar5 * fVar147 + *pfVar1 * fVar105;
      fStack_2c4 = pfVar5[1] * fVar147 + pfVar1[1] * fVar105;
      fStack_2c0 = pfVar5[2] * fVar147 + pfVar1[2] * fVar105;
      fStack_2bc = pfVar5[3] * fVar147 + pfVar1[3] * fVar105;
      fVar255 = *pfVar6 * fVar147 + *pfVar2 * fVar105;
      fVar256 = pfVar6[1] * fVar147 + pfVar2[1] * fVar105;
      fVar299 = pfVar6[2] * fVar147 + pfVar2[2] * fVar105;
      fStack_10c = pfVar6[3] * fVar147 + pfVar2[3] * fVar105;
      pfVar1 = (float *)(lVar62 + lVar22 * (uVar64 + 2));
      fVar235 = *pfVar1 * fVar147 + *pfVar3 * fVar105;
      fVar238 = pfVar1[1] * fVar147 + pfVar3[1] * fVar105;
      fVar248 = pfVar1[2] * fVar147 + pfVar3[2] * fVar105;
      fStack_11c = pfVar1[3] * fVar147 + pfVar3[3] * fVar105;
      pfVar1 = (float *)(lVar62 + lVar22 * (uVar64 + 3));
      fVar213 = fVar147 * *pfVar1 + fVar105 * *pfVar4;
      fVar216 = fVar147 * pfVar1[1] + fVar105 * pfVar4[1];
      fVar222 = fVar147 * pfVar1[2] + fVar105 * pfVar4[2];
      fStack_fc = fVar147 * pfVar1[3] + fVar105 * pfVar4[3];
      iVar18 = (int)pGVar19[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      fVar147 = *(float *)(ray + k * 4);
      fVar73 = *(float *)(ray + k * 4 + 0x10);
      fVar105 = *(float *)(ray + k * 4 + 0x20);
      fVar171 = local_2c8 - fVar147;
      fVar183 = fStack_2c4 - fVar73;
      fVar185 = fStack_2c0 - fVar105;
      fVar106 = (local_238->vx).field_0.m128[0];
      fVar108 = (local_238->vx).field_0.m128[1];
      fVar130 = (local_238->vx).field_0.m128[2];
      fVar133 = (local_238->vy).field_0.m128[0];
      fVar138 = (local_238->vy).field_0.m128[1];
      fVar145 = (local_238->vy).field_0.m128[2];
      fVar150 = (local_238->vz).field_0.m128[0];
      fVar163 = (local_238->vz).field_0.m128[1];
      fVar166 = (local_238->vz).field_0.m128[2];
      local_348 = fVar171 * fVar106 + fVar183 * fVar133 + fVar185 * fVar150;
      local_258 = fVar171 * fVar108 + fVar183 * fVar138 + fVar185 * fVar163;
      fVar188 = fVar171 * fVar130 + fVar183 * fVar145 + fVar185 * fVar166;
      fVar171 = fVar255 - fVar147;
      fVar183 = fVar256 - fVar73;
      fVar185 = fVar299 - fVar105;
      local_248 = fVar171 * fVar106 + fVar183 * fVar133 + fVar185 * fVar150;
      local_2a8 = fVar171 * fVar108 + fVar183 * fVar138 + fVar185 * fVar163;
      fVar211 = fVar171 * fVar130 + fVar183 * fVar145 + fVar185 * fVar166;
      fVar171 = fVar235 - fVar147;
      fVar183 = fVar238 - fVar73;
      fVar185 = fVar248 - fVar105;
      fVar224 = fVar171 * fVar106 + fVar183 * fVar133 + fVar185 * fVar150;
      fVar227 = fVar171 * fVar108 + fVar183 * fVar138 + fVar185 * fVar163;
      local_288 = fVar171 * fVar130 + fVar183 * fVar145 + fVar185 * fVar166;
      fVar147 = fVar213 - fVar147;
      fVar73 = fVar216 - fVar73;
      fVar105 = fVar222 - fVar105;
      local_338 = fVar147 * fVar106 + fVar73 * fVar133 + fVar105 * fVar150;
      fVar106 = fVar147 * fVar108 + fVar73 * fVar138 + fVar105 * fVar163;
      local_298 = fVar147 * fVar130 + fVar73 * fVar145 + fVar105 * fVar166;
      auVar263._0_8_ = CONCAT44(local_258,local_348) & 0x7fffffff7fffffff;
      auVar263._8_4_ = ABS(fVar188);
      auVar263._12_4_ = ABS(fStack_2bc);
      auVar173._0_8_ = CONCAT44(local_2a8,local_248) & 0x7fffffff7fffffff;
      auVar173._8_4_ = ABS(fVar211);
      auVar173._12_4_ = ABS(fStack_10c);
      auVar141 = maxps(auVar263,auVar173);
      auVar206._0_8_ = CONCAT44(fVar227,fVar224) & 0x7fffffff7fffffff;
      auVar206._8_4_ = ABS(local_288);
      auVar206._12_4_ = ABS(fStack_11c);
      auVar122._0_8_ = CONCAT44(fVar106,local_338) & 0x7fffffff7fffffff;
      auVar122._8_4_ = ABS(local_298);
      auVar122._12_4_ = ABS(fStack_fc);
      auVar74 = maxps(auVar206,auVar122);
      auVar74 = maxps(auVar141,auVar74);
      uVar107 = auVar74._8_8_;
      fVar147 = auVar74._4_4_;
      if (auVar74._4_4_ <= auVar74._0_4_) {
        fVar147 = auVar74._0_4_;
      }
      auVar264._8_8_ = uVar107;
      auVar264._0_8_ = uVar107;
      fVar73 = (float)iVar18;
      local_2e8 = ZEXT416((uint)fVar73);
      if (auVar74._8_4_ <= fVar147) {
        auVar265._4_12_ = auVar264._4_12_;
        auVar265._0_4_ = fVar147;
        uVar107 = auVar265._0_8_;
      }
      pRVar58 = (RTCIntersectArguments *)((long)iVar18 * 0x40);
      lVar22 = (long)iVar18 * 0x44;
      fVar147 = *(float *)*(undefined1 (*) [12])(catmullrom_basis0 + lVar22 + 0x908);
      fVar105 = *(float *)(catmullrom_basis0 + lVar22 + 0x90c);
      fVar108 = *(float *)(catmullrom_basis0 + lVar22 + 0x910);
      auVar26 = *(undefined1 (*) [12])(catmullrom_basis0 + lVar22 + 0x908);
      fVar130 = *(float *)(catmullrom_basis0 + lVar22 + 0x914);
      fVar133 = *(float *)(catmullrom_basis0 + lVar22 + 0xd8c);
      fVar138 = *(float *)(catmullrom_basis0 + lVar22 + 0xd90);
      fVar145 = *(float *)(catmullrom_basis0 + lVar22 + 0xd94);
      fVar150 = *(float *)(catmullrom_basis0 + lVar22 + 0xd98);
      local_128 = fVar235;
      fStack_124 = fVar238;
      fStack_120 = fVar248;
      local_108 = fVar213;
      fStack_104 = fVar216;
      fStack_100 = fVar222;
      fVar163 = *(float *)(catmullrom_basis0 + lVar22 + 0x484);
      fVar166 = *(float *)(catmullrom_basis0 + lVar22 + 0x488);
      fVar171 = *(float *)(catmullrom_basis0 + lVar22 + 0x48c);
      fVar183 = *(float *)(catmullrom_basis0 + lVar22 + 0x490);
      local_118 = fVar255;
      fStack_114 = fVar256;
      fStack_110 = fVar299;
      fVar185 = *(float *)*(undefined1 (*) [12])(catmullrom_basis0 + lVar22);
      fVar243 = *(float *)(catmullrom_basis0 + lVar22 + 4);
      fVar246 = *(float *)(catmullrom_basis0 + lVar22 + 8);
      auVar27 = *(undefined1 (*) [12])(catmullrom_basis0 + lVar22);
      fVar247 = *(float *)(catmullrom_basis0 + lVar22 + 0xc);
      fVar228 = local_348 * fVar185 + local_248 * fVar163 + fVar224 * fVar147 + local_338 * fVar133;
      fVar236 = local_348 * fVar243 + local_248 * fVar166 + fVar224 * fVar105 + local_338 * fVar138;
      fVar239 = local_348 * fVar246 + local_248 * fVar171 + fVar224 * fVar108 + local_338 * fVar145;
      fVar241 = local_348 * fVar247 + local_248 * fVar183 + fVar224 * fVar130 + local_338 * fVar150;
      fVar151 = local_258 * fVar185 + local_2a8 * fVar163 + fVar227 * fVar147 + fVar106 * fVar133;
      fVar164 = local_258 * fVar243 + local_2a8 * fVar166 + fVar227 * fVar105 + fVar106 * fVar138;
      fVar167 = local_258 * fVar246 + local_2a8 * fVar171 + fVar227 * fVar108 + fVar106 * fVar145;
      fVar169 = local_258 * fVar247 + local_2a8 * fVar183 + fVar227 * fVar130 + fVar106 * fVar150;
      fVar300 = fStack_2bc * fVar185 +
                fStack_10c * fVar163 + fStack_11c * fVar147 + fStack_fc * fVar133;
      fVar305 = fStack_2bc * fVar243 +
                fStack_10c * fVar166 + fStack_11c * fVar105 + fStack_fc * fVar138;
      auVar244._4_4_ = fVar305;
      auVar244._0_4_ = fVar300;
      fVar306 = fStack_2bc * fVar246 +
                fStack_10c * fVar171 + fStack_11c * fVar108 + fStack_fc * fVar145;
      fVar307 = fStack_2bc * fVar247 +
                fStack_10c * fVar183 + fStack_11c * fVar130 + fStack_fc * fVar150;
      fVar105 = *(float *)(catmullrom_basis1 + lVar22 + 0xd8c);
      fVar108 = *(float *)(catmullrom_basis1 + lVar22 + 0xd90);
      fVar185 = *(float *)(catmullrom_basis1 + lVar22 + 0xd94);
      fVar243 = *(float *)(catmullrom_basis1 + lVar22 + 0xd98);
      local_268 = *(float *)(catmullrom_basis1 + lVar22 + 0x908);
      fStack_264 = *(float *)(catmullrom_basis1 + lVar22 + 0x90c);
      fStack_260 = *(float *)(catmullrom_basis1 + lVar22 + 0x910);
      fStack_25c = *(float *)(catmullrom_basis1 + lVar22 + 0x914);
      local_148 = fStack_fc;
      fStack_144 = fStack_fc;
      fStack_140 = fStack_fc;
      fStack_13c = fStack_fc;
      local_138 = fStack_11c;
      fStack_134 = fStack_11c;
      fStack_130 = fStack_11c;
      fStack_12c = fStack_11c;
      fVar246 = *(float *)(catmullrom_basis1 + lVar22 + 0x484);
      fVar257 = *(float *)(catmullrom_basis1 + lVar22 + 0x488);
      fVar266 = *(float *)(catmullrom_basis1 + lVar22 + 0x48c);
      fVar269 = *(float *)(catmullrom_basis1 + lVar22 + 0x490);
      local_158 = fStack_10c;
      fStack_154 = fStack_10c;
      fStack_150 = fStack_10c;
      fStack_14c = fStack_10c;
      fVar274 = *(float *)(catmullrom_basis1 + lVar22);
      fVar281 = *(float *)(catmullrom_basis1 + lVar22 + 4);
      fVar282 = *(float *)(catmullrom_basis1 + lVar22 + 8);
      fVar283 = *(float *)(catmullrom_basis1 + lVar22 + 0xc);
      fVar217 = local_348 * fVar274 +
                local_248 * fVar246 + fVar224 * local_268 + local_338 * fVar105;
      fVar223 = local_348 * fVar281 +
                local_248 * fVar257 + fVar224 * fStack_264 + local_338 * fVar108;
      fVar225 = local_348 * fVar282 +
                local_248 * fVar266 + fVar224 * fStack_260 + local_338 * fVar185;
      fVar226 = local_348 * fVar283 +
                local_248 * fVar269 + fVar224 * fStack_25c + local_338 * fVar243;
      fVar284 = local_258 * fVar274 + local_2a8 * fVar246 + fVar227 * local_268 + fVar106 * fVar105;
      fVar293 = local_258 * fVar281 + local_2a8 * fVar257 + fVar227 * fStack_264 + fVar106 * fVar108
      ;
      fVar295 = local_258 * fVar282 + local_2a8 * fVar266 + fVar227 * fStack_260 + fVar106 * fVar185
      ;
      fVar297 = local_258 * fVar283 + local_2a8 * fVar269 + fVar227 * fStack_25c + fVar106 * fVar243
      ;
      local_168 = fStack_2bc;
      fStack_164 = fStack_2bc;
      fStack_160 = fStack_2bc;
      fStack_15c = fStack_2bc;
      fVar310 = fStack_2bc * fVar274 +
                fStack_10c * fVar246 + fStack_11c * local_268 + fStack_fc * fVar105;
      fVar312 = fStack_2bc * fVar281 +
                fStack_10c * fVar257 + fStack_11c * fStack_264 + fStack_fc * fVar108;
      fVar314 = fStack_2bc * fVar282 +
                fStack_10c * fVar266 + fStack_11c * fStack_260 + fStack_fc * fVar185;
      fVar316 = fStack_2bc * fVar283 +
                fStack_10c * fVar269 + fStack_11c * fStack_25c + fStack_fc * fVar243;
      fVar189 = fVar217 - fVar228;
      fVar212 = fVar223 - fVar236;
      fVar214 = fVar225 - fVar239;
      fVar215 = fVar226 - fVar241;
      fVar172 = fVar284 - fVar151;
      fVar184 = fVar293 - fVar164;
      fVar186 = fVar295 - fVar167;
      fVar187 = fVar297 - fVar169;
      fVar147 = fVar151 * fVar189 - fVar228 * fVar172;
      fVar165 = fVar164 * fVar212 - fVar236 * fVar184;
      fVar168 = fVar167 * fVar214 - fVar239 * fVar186;
      fVar170 = fVar169 * fVar215 - fVar241 * fVar187;
      auVar244._8_4_ = fVar306;
      auVar244._12_4_ = fVar307;
      auVar23._4_4_ = fVar312;
      auVar23._0_4_ = fVar310;
      auVar23._8_4_ = fVar314;
      auVar23._12_4_ = fVar316;
      auVar74 = maxps(auVar244,auVar23);
      bVar50 = fVar147 * fVar147 <=
               auVar74._0_4_ * auVar74._0_4_ * (fVar189 * fVar189 + fVar172 * fVar172) &&
               0.0 < fVar73;
      auVar157._0_4_ = -(uint)bVar50;
      bVar51 = fVar165 * fVar165 <=
               auVar74._4_4_ * auVar74._4_4_ * (fVar212 * fVar212 + fVar184 * fVar184) &&
               1.0 < fVar73;
      auVar157._4_4_ = -(uint)bVar51;
      bVar49 = fVar168 * fVar168 <=
               auVar74._8_4_ * auVar74._8_4_ * (fVar214 * fVar214 + fVar186 * fVar186) &&
               2.0 < fVar73;
      auVar157._8_4_ = -(uint)bVar49;
      bVar65 = fVar170 * fVar170 <=
               auVar74._12_4_ * auVar74._12_4_ * (fVar215 * fVar215 + fVar187 * fVar187) &&
               3.0 < fVar73;
      auVar157._12_4_ = -(uint)bVar65;
      local_448 = (float)uVar107;
      local_448 = local_448 * 4.7683716e-07;
      iVar53 = movmskps(iVar18,auVar157);
      fVar147 = *(float *)(ray + k * 4 + 0x30);
      _local_2b8 = ZEXT416((uint)fVar147);
      fStack_344 = local_348;
      fStack_340 = local_348;
      fStack_33c = local_348;
      fStack_334 = local_338;
      fStack_330 = local_338;
      fStack_32c = local_338;
      fStack_2a4 = local_2a8;
      fStack_2a0 = local_2a8;
      fStack_29c = local_2a8;
      fStack_294 = local_298;
      fStack_290 = local_298;
      fStack_28c = local_298;
      fStack_284 = local_288;
      fStack_280 = local_288;
      fStack_27c = local_288;
      fStack_254 = local_258;
      fStack_250 = local_258;
      fStack_24c = local_258;
      fStack_244 = local_248;
      fStack_240 = local_248;
      fStack_23c = local_248;
      if (iVar53 == 0) {
LAB_00c30869:
        bVar65 = false;
      }
      else {
        fVar139 = fVar105 * local_298 + local_268 * local_288 + fVar246 * fVar211 +
                  fVar274 * fVar188;
        fVar146 = fVar108 * local_298 + fStack_264 * local_288 + fVar257 * fVar211 +
                  fVar281 * fVar188;
        fVar148 = fVar185 * local_298 + fStack_260 * local_288 + fVar266 * fVar211 +
                  fVar282 * fVar188;
        fVar149 = fVar243 * local_298 + fStack_25c * local_288 + fVar269 * fVar211 +
                  fVar283 * fVar188;
        local_3f8 = auVar27._0_4_;
        fStack_3f4 = auVar27._4_4_;
        fStack_3f0 = auVar27._8_4_;
        local_428._0_4_ = auVar26._0_4_;
        local_428._4_4_ = auVar26._4_4_;
        uStack_420._0_4_ = auVar26._8_4_;
        fVar109 = fVar133 * local_298 + (float)local_428 * local_288 + fVar163 * fVar211 +
                  local_3f8 * fVar188;
        fVar131 = fVar138 * local_298 + local_428._4_4_ * local_288 + fVar166 * fVar211 +
                  fStack_3f4 * fVar188;
        fVar134 = fVar145 * local_298 + (float)uStack_420 * local_288 + fVar171 * fVar211 +
                  fStack_3f0 * fVar188;
        fVar136 = fVar150 * local_298 + fVar130 * local_288 + fVar183 * fVar211 + fVar247 * fVar188;
        fVar105 = *(float *)(catmullrom_basis0 + lVar22 + 0x1210);
        fVar108 = *(float *)(catmullrom_basis0 + lVar22 + 0x1214);
        fVar130 = *(float *)(catmullrom_basis0 + lVar22 + 0x1218);
        fVar133 = *(float *)(catmullrom_basis0 + lVar22 + 0x121c);
        fVar138 = *(float *)(catmullrom_basis0 + lVar22 + 0x1694);
        fVar145 = *(float *)(catmullrom_basis0 + lVar22 + 0x1698);
        fVar150 = *(float *)(catmullrom_basis0 + lVar22 + 0x169c);
        fVar163 = *(float *)(catmullrom_basis0 + lVar22 + 0x16a0);
        fVar166 = *(float *)(catmullrom_basis0 + lVar22 + 0x1b18);
        fVar171 = *(float *)(catmullrom_basis0 + lVar22 + 0x1b1c);
        fVar183 = *(float *)(catmullrom_basis0 + lVar22 + 0x1b20);
        fVar185 = *(float *)(catmullrom_basis0 + lVar22 + 0x1b24);
        fVar243 = *(float *)(catmullrom_basis0 + lVar22 + 0x1f9c);
        fVar246 = *(float *)(catmullrom_basis0 + lVar22 + 0x1fa0);
        fVar247 = *(float *)(catmullrom_basis0 + lVar22 + 0x1fa4);
        fVar257 = *(float *)(catmullrom_basis0 + lVar22 + 0x1fa8);
        fVar258 = local_348 * fVar105 +
                  local_248 * fVar138 + fVar224 * fVar166 + local_338 * fVar243;
        fVar267 = local_348 * fVar108 +
                  local_248 * fVar145 + fVar224 * fVar171 + local_338 * fVar246;
        fVar270 = local_348 * fVar130 +
                  local_248 * fVar150 + fVar224 * fVar183 + local_338 * fVar247;
        fVar272 = local_348 * fVar133 +
                  local_248 * fVar163 + fVar224 * fVar185 + local_338 * fVar257;
        fVar311 = local_258 * fVar105 + local_2a8 * fVar138 + fVar227 * fVar166 + fVar106 * fVar243;
        fVar313 = local_258 * fVar108 + local_2a8 * fVar145 + fVar227 * fVar171 + fVar106 * fVar246;
        fVar315 = local_258 * fVar130 + local_2a8 * fVar150 + fVar227 * fVar183 + fVar106 * fVar247;
        fVar317 = local_258 * fVar133 + local_2a8 * fVar163 + fVar227 * fVar185 + fVar106 * fVar257;
        fVar266 = *(float *)(catmullrom_basis1 + lVar22 + 0x1210);
        fVar269 = *(float *)(catmullrom_basis1 + lVar22 + 0x1214);
        fVar274 = *(float *)(catmullrom_basis1 + lVar22 + 0x1218);
        fVar281 = *(float *)(catmullrom_basis1 + lVar22 + 0x121c);
        fVar282 = *(float *)(catmullrom_basis1 + lVar22 + 0x1b18);
        fVar283 = *(float *)(catmullrom_basis1 + lVar22 + 0x1b1c);
        fVar165 = *(float *)(catmullrom_basis1 + lVar22 + 0x1b20);
        fVar168 = *(float *)(catmullrom_basis1 + lVar22 + 0x1b24);
        fVar170 = *(float *)(catmullrom_basis1 + lVar22 + 0x1f9c);
        fVar268 = *(float *)(catmullrom_basis1 + lVar22 + 0x1fa0);
        fVar271 = *(float *)(catmullrom_basis1 + lVar22 + 0x1fa4);
        fVar273 = *(float *)(catmullrom_basis1 + lVar22 + 0x1fa8);
        fVar285 = *(float *)(catmullrom_basis1 + lVar22 + 0x1694);
        fVar294 = *(float *)(catmullrom_basis1 + lVar22 + 0x1698);
        fVar296 = *(float *)(catmullrom_basis1 + lVar22 + 0x169c);
        fVar298 = *(float *)(catmullrom_basis1 + lVar22 + 0x16a0);
        auVar174._0_4_ = local_248 * fVar285 + fVar224 * fVar282 + local_338 * fVar170;
        auVar174._4_4_ = local_248 * fVar294 + fVar224 * fVar283 + local_338 * fVar268;
        auVar174._8_4_ = local_248 * fVar296 + fVar224 * fVar165 + local_338 * fVar271;
        auVar174._12_4_ = local_248 * fVar298 + fVar224 * fVar168 + local_338 * fVar273;
        fVar229 = local_348 * fVar266 + auVar174._0_4_;
        fVar237 = local_348 * fVar269 + auVar174._4_4_;
        fVar240 = local_348 * fVar274 + auVar174._8_4_;
        fVar242 = local_348 * fVar281 + auVar174._12_4_;
        fVar110 = local_258 * fVar266 + local_2a8 * fVar285 + fVar227 * fVar282 + fVar106 * fVar170;
        fVar132 = local_258 * fVar269 + local_2a8 * fVar294 + fVar227 * fVar283 + fVar106 * fVar268;
        fVar135 = local_258 * fVar274 + local_2a8 * fVar296 + fVar227 * fVar165 + fVar106 * fVar271;
        fVar137 = local_258 * fVar281 + local_2a8 * fVar298 + fVar227 * fVar168 + fVar106 * fVar273;
        auVar291._0_8_ = CONCAT44(fVar267,fVar258) & 0x7fffffff7fffffff;
        auVar291._8_4_ = ABS(fVar270);
        auVar291._12_4_ = ABS(fVar272);
        auVar245._0_8_ = CONCAT44(fVar313,fVar311) & 0x7fffffff7fffffff;
        auVar245._8_4_ = ABS(fVar315);
        auVar245._12_4_ = ABS(fVar317);
        auVar74 = maxps(auVar291,auVar245);
        auVar301._0_8_ =
             CONCAT44(fVar108 * fVar188 +
                      fVar145 * fVar211 + fVar171 * local_288 + fVar246 * local_298,
                      fVar105 * fVar188 +
                      fVar138 * fVar211 + fVar166 * local_288 + fVar243 * local_298) &
             0x7fffffff7fffffff;
        auVar301._8_4_ =
             ABS(fVar130 * fVar188 + fVar150 * fVar211 + fVar183 * local_288 + fVar247 * local_298);
        auVar301._12_4_ =
             ABS(fVar133 * fVar188 + fVar163 * fVar211 + fVar185 * local_288 + fVar257 * local_298);
        auVar74 = maxps(auVar74,auVar301);
        uVar67 = -(uint)(local_448 <= auVar74._0_4_);
        uVar68 = -(uint)(local_448 <= auVar74._4_4_);
        uVar69 = -(uint)(local_448 <= auVar74._8_4_);
        uVar70 = -(uint)(local_448 <= auVar74._12_4_);
        fVar138 = (float)((uint)fVar258 & uVar67 | ~uVar67 & (uint)fVar189);
        fVar145 = (float)((uint)fVar267 & uVar68 | ~uVar68 & (uint)fVar212);
        fVar150 = (float)((uint)fVar270 & uVar69 | ~uVar69 & (uint)fVar214);
        fVar163 = (float)((uint)fVar272 & uVar70 | ~uVar70 & (uint)fVar215);
        fVar166 = (float)(~uVar67 & (uint)fVar172 | (uint)fVar311 & uVar67);
        fVar171 = (float)(~uVar68 & (uint)fVar184 | (uint)fVar313 & uVar68);
        fVar183 = (float)(~uVar69 & (uint)fVar186 | (uint)fVar315 & uVar69);
        fVar185 = (float)(~uVar70 & (uint)fVar187 | (uint)fVar317 & uVar70);
        auVar302._0_8_ = CONCAT44(fVar237,fVar229) & 0x7fffffff7fffffff;
        auVar302._8_4_ = ABS(fVar240);
        auVar302._12_4_ = ABS(fVar242);
        auVar254._0_8_ = CONCAT44(fVar132,fVar110) & 0x7fffffff7fffffff;
        auVar254._8_4_ = ABS(fVar135);
        auVar254._12_4_ = ABS(fVar137);
        auVar74 = maxps(auVar302,auVar254);
        auVar219._0_8_ =
             CONCAT44(fVar269 * fVar188 +
                      fVar294 * fVar211 + fVar283 * local_288 + fVar268 * local_298,
                      fVar266 * fVar188 +
                      fVar285 * fVar211 + fVar282 * local_288 + fVar170 * local_298) &
             0x7fffffff7fffffff;
        auVar219._8_4_ =
             ABS(fVar274 * fVar188 + fVar296 * fVar211 + fVar165 * local_288 + fVar271 * local_298);
        auVar219._12_4_ =
             ABS(fVar281 * fVar188 + fVar298 * fVar211 + fVar168 * local_288 + fVar273 * local_298);
        auVar74 = maxps(auVar74,auVar219);
        uVar67 = -(uint)(local_448 <= auVar74._0_4_);
        uVar68 = -(uint)(local_448 <= auVar74._4_4_);
        uVar69 = -(uint)(local_448 <= auVar74._8_4_);
        uVar70 = -(uint)(local_448 <= auVar74._12_4_);
        fVar243 = (float)((uint)fVar229 & uVar67 | ~uVar67 & (uint)fVar189);
        fVar246 = (float)((uint)fVar237 & uVar68 | ~uVar68 & (uint)fVar212);
        fVar247 = (float)((uint)fVar240 & uVar69 | ~uVar69 & (uint)fVar214);
        fVar257 = (float)((uint)fVar242 & uVar70 | ~uVar70 & (uint)fVar215);
        fVar282 = (float)(~uVar67 & (uint)fVar172 | (uint)fVar110 & uVar67);
        fVar283 = (float)(~uVar68 & (uint)fVar184 | (uint)fVar132 & uVar68);
        fVar165 = (float)(~uVar69 & (uint)fVar186 | (uint)fVar135 & uVar69);
        fVar168 = (float)(~uVar70 & (uint)fVar187 | (uint)fVar137 & uVar70);
        auVar123._0_4_ = fVar166 * fVar166 + fVar138 * fVar138;
        auVar123._4_4_ = fVar171 * fVar171 + fVar145 * fVar145;
        auVar123._8_4_ = fVar183 * fVar183 + fVar150 * fVar150;
        auVar123._12_4_ = fVar185 * fVar185 + fVar163 * fVar163;
        auVar74 = rsqrtps(auVar174,auVar123);
        fVar105 = auVar74._0_4_;
        fVar108 = auVar74._4_4_;
        fVar130 = auVar74._8_4_;
        fVar133 = auVar74._12_4_;
        auVar175._0_4_ = fVar105 * fVar105 * auVar123._0_4_ * 0.5 * fVar105;
        auVar175._4_4_ = fVar108 * fVar108 * auVar123._4_4_ * 0.5 * fVar108;
        auVar175._8_4_ = fVar130 * fVar130 * auVar123._8_4_ * 0.5 * fVar130;
        auVar175._12_4_ = fVar133 * fVar133 * auVar123._12_4_ * 0.5 * fVar133;
        fVar170 = fVar105 * 1.5 - auVar175._0_4_;
        fVar172 = fVar108 * 1.5 - auVar175._4_4_;
        fVar184 = fVar130 * 1.5 - auVar175._8_4_;
        fVar186 = fVar133 * 1.5 - auVar175._12_4_;
        auVar124._0_4_ = fVar282 * fVar282 + fVar243 * fVar243;
        auVar124._4_4_ = fVar283 * fVar283 + fVar246 * fVar246;
        auVar124._8_4_ = fVar165 * fVar165 + fVar247 * fVar247;
        auVar124._12_4_ = fVar168 * fVar168 + fVar257 * fVar257;
        auVar74 = rsqrtps(auVar175,auVar124);
        fVar105 = auVar74._0_4_;
        fVar108 = auVar74._4_4_;
        fVar130 = auVar74._8_4_;
        fVar133 = auVar74._12_4_;
        fVar266 = fVar105 * 1.5 - fVar105 * fVar105 * auVar124._0_4_ * 0.5 * fVar105;
        fVar269 = fVar108 * 1.5 - fVar108 * fVar108 * auVar124._4_4_ * 0.5 * fVar108;
        fVar274 = fVar130 * 1.5 - fVar130 * fVar130 * auVar124._8_4_ * 0.5 * fVar130;
        fVar281 = fVar133 * 1.5 - fVar133 * fVar133 * auVar124._12_4_ * 0.5 * fVar133;
        fVar285 = fVar166 * fVar170 * fVar300;
        fVar294 = fVar171 * fVar172 * fVar305;
        fVar296 = fVar183 * fVar184 * fVar306;
        fVar298 = fVar185 * fVar186 * fVar307;
        fVar166 = -fVar138 * fVar170 * fVar300;
        fVar171 = -fVar145 * fVar172 * fVar305;
        fVar183 = -fVar150 * fVar184 * fVar306;
        fVar185 = -fVar163 * fVar186 * fVar307;
        fVar229 = fVar170 * 0.0 * fVar300;
        fVar237 = fVar172 * 0.0 * fVar305;
        fVar240 = fVar184 * 0.0 * fVar306;
        fVar242 = fVar186 * 0.0 * fVar307;
        fVar110 = fVar282 * fVar266 * fVar310;
        fVar132 = fVar283 * fVar269 * fVar312;
        fVar135 = fVar165 * fVar274 * fVar314;
        fVar137 = fVar168 * fVar281 * fVar316;
        fVar138 = fVar217 + fVar110;
        fVar145 = fVar223 + fVar132;
        fVar150 = fVar225 + fVar135;
        fVar163 = fVar226 + fVar137;
        fVar187 = -fVar243 * fVar266 * fVar310;
        fVar189 = -fVar246 * fVar269 * fVar312;
        fVar212 = -fVar247 * fVar274 * fVar314;
        fVar214 = -fVar257 * fVar281 * fVar316;
        fVar105 = fVar284 + fVar187;
        fVar108 = fVar293 + fVar189;
        fVar130 = fVar295 + fVar212;
        fVar133 = fVar297 + fVar214;
        fVar282 = fVar266 * 0.0 * fVar310;
        fVar283 = fVar269 * 0.0 * fVar312;
        fVar184 = fVar274 * 0.0 * fVar314;
        fVar186 = fVar281 * 0.0 * fVar316;
        fVar243 = fVar228 - fVar285;
        fVar246 = fVar236 - fVar294;
        fVar247 = fVar239 - fVar296;
        fVar257 = fVar241 - fVar298;
        fVar215 = fVar139 + fVar282;
        fVar268 = fVar146 + fVar283;
        fVar271 = fVar148 + fVar184;
        fVar273 = fVar149 + fVar186;
        fVar165 = fVar151 - fVar166;
        fVar168 = fVar164 - fVar171;
        fVar170 = fVar167 - fVar183;
        fVar172 = fVar169 - fVar185;
        fVar266 = fVar109 - fVar229;
        fVar269 = fVar131 - fVar237;
        fVar274 = fVar134 - fVar240;
        fVar281 = fVar136 - fVar242;
        uVar67 = -(uint)(0.0 < (fVar165 * (fVar215 - fVar266) - fVar266 * (fVar105 - fVar165)) * 0.0
                               + (fVar266 * (fVar138 - fVar243) - (fVar215 - fVar266) * fVar243) *
                                 0.0 + ((fVar105 - fVar165) * fVar243 -
                                       (fVar138 - fVar243) * fVar165));
        uVar68 = -(uint)(0.0 < (fVar168 * (fVar268 - fVar269) - fVar269 * (fVar108 - fVar168)) * 0.0
                               + (fVar269 * (fVar145 - fVar246) - (fVar268 - fVar269) * fVar246) *
                                 0.0 + ((fVar108 - fVar168) * fVar246 -
                                       (fVar145 - fVar246) * fVar168));
        uVar69 = -(uint)(0.0 < (fVar170 * (fVar271 - fVar274) - fVar274 * (fVar130 - fVar170)) * 0.0
                               + (fVar274 * (fVar150 - fVar247) - (fVar271 - fVar274) * fVar247) *
                                 0.0 + ((fVar130 - fVar170) * fVar247 -
                                       (fVar150 - fVar247) * fVar170));
        uVar70 = -(uint)(0.0 < (fVar172 * (fVar273 - fVar281) - fVar281 * (fVar133 - fVar172)) * 0.0
                               + (fVar281 * (fVar163 - fVar257) - (fVar273 - fVar281) * fVar257) *
                                 0.0 + ((fVar133 - fVar172) * fVar257 -
                                       (fVar163 - fVar257) * fVar172));
        fVar228 = (float)((uint)(fVar217 - fVar110) & uVar67 | ~uVar67 & (uint)(fVar228 + fVar285));
        fVar236 = (float)((uint)(fVar223 - fVar132) & uVar68 | ~uVar68 & (uint)(fVar236 + fVar294));
        fVar239 = (float)((uint)(fVar225 - fVar135) & uVar69 | ~uVar69 & (uint)(fVar239 + fVar296));
        fVar226 = (float)((uint)(fVar226 - fVar137) & uVar70 | ~uVar70 & (uint)(fVar241 + fVar298));
        fVar187 = (float)((uint)(fVar284 - fVar187) & uVar67 | ~uVar67 & (uint)(fVar151 + fVar166));
        fVar189 = (float)((uint)(fVar293 - fVar189) & uVar68 | ~uVar68 & (uint)(fVar164 + fVar171));
        fVar212 = (float)((uint)(fVar295 - fVar212) & uVar69 | ~uVar69 & (uint)(fVar167 + fVar183));
        fVar214 = (float)((uint)(fVar297 - fVar214) & uVar70 | ~uVar70 & (uint)(fVar169 + fVar185));
        fVar166 = (float)((uint)(fVar139 - fVar282) & uVar67 | ~uVar67 & (uint)(fVar109 + fVar229));
        fVar171 = (float)((uint)(fVar146 - fVar283) & uVar68 | ~uVar68 & (uint)(fVar131 + fVar237));
        fVar183 = (float)((uint)(fVar148 - fVar184) & uVar69 | ~uVar69 & (uint)(fVar134 + fVar240));
        fVar185 = (float)((uint)(fVar149 - fVar186) & uVar70 | ~uVar70 & (uint)(fVar136 + fVar242));
        fVar282 = (float)((uint)fVar243 & uVar67 | ~uVar67 & (uint)fVar138);
        fVar283 = (float)((uint)fVar246 & uVar68 | ~uVar68 & (uint)fVar145);
        fVar284 = (float)((uint)fVar247 & uVar69 | ~uVar69 & (uint)fVar150);
        fVar293 = (float)((uint)fVar257 & uVar70 | ~uVar70 & (uint)fVar163);
        fVar295 = (float)((uint)fVar165 & uVar67 | ~uVar67 & (uint)fVar105);
        fVar297 = (float)((uint)fVar168 & uVar68 | ~uVar68 & (uint)fVar108);
        fVar151 = (float)((uint)fVar170 & uVar69 | ~uVar69 & (uint)fVar130);
        fVar164 = (float)((uint)fVar172 & uVar70 | ~uVar70 & (uint)fVar133);
        fVar184 = (float)((uint)fVar266 & uVar67 | ~uVar67 & (uint)fVar215);
        fVar186 = (float)((uint)fVar269 & uVar68 | ~uVar68 & (uint)fVar268);
        fVar217 = (float)((uint)fVar274 & uVar69 | ~uVar69 & (uint)fVar271);
        fVar223 = (float)((uint)fVar281 & uVar70 | ~uVar70 & (uint)fVar273);
        fVar243 = (float)((uint)fVar138 & uVar67 | ~uVar67 & (uint)fVar243) - fVar228;
        fVar246 = (float)((uint)fVar145 & uVar68 | ~uVar68 & (uint)fVar246) - fVar236;
        fVar247 = (float)((uint)fVar150 & uVar69 | ~uVar69 & (uint)fVar247) - fVar239;
        fVar257 = (float)((uint)fVar163 & uVar70 | ~uVar70 & (uint)fVar257) - fVar226;
        fVar105 = (float)((uint)fVar105 & uVar67 | ~uVar67 & (uint)fVar165) - fVar187;
        fVar108 = (float)((uint)fVar108 & uVar68 | ~uVar68 & (uint)fVar168) - fVar189;
        fVar130 = (float)((uint)fVar130 & uVar69 | ~uVar69 & (uint)fVar170) - fVar212;
        fVar133 = (float)((uint)fVar133 & uVar70 | ~uVar70 & (uint)fVar172) - fVar214;
        fVar165 = (float)((uint)fVar215 & uVar67 | ~uVar67 & (uint)fVar266) - fVar166;
        fVar167 = (float)((uint)fVar268 & uVar68 | ~uVar68 & (uint)fVar269) - fVar171;
        fVar168 = (float)((uint)fVar271 & uVar69 | ~uVar69 & (uint)fVar274) - fVar183;
        fVar169 = (float)((uint)fVar273 & uVar70 | ~uVar70 & (uint)fVar281) - fVar185;
        fVar241 = fVar228 - fVar282;
        fVar268 = fVar236 - fVar283;
        fVar271 = fVar239 - fVar284;
        fVar273 = fVar226 - fVar293;
        fVar266 = fVar187 - fVar295;
        fVar269 = fVar189 - fVar297;
        fVar274 = fVar212 - fVar151;
        fVar281 = fVar214 - fVar164;
        fVar138 = fVar166 - fVar184;
        fVar145 = fVar171 - fVar186;
        fVar150 = fVar183 - fVar217;
        fVar163 = fVar185 - fVar223;
        fVar170 = (fVar187 * fVar165 - fVar166 * fVar105) * 0.0 +
                  (fVar166 * fVar243 - fVar228 * fVar165) * 0.0 +
                  (fVar228 * fVar105 - fVar187 * fVar243);
        fVar172 = (fVar189 * fVar167 - fVar171 * fVar108) * 0.0 +
                  (fVar171 * fVar246 - fVar236 * fVar167) * 0.0 +
                  (fVar236 * fVar108 - fVar189 * fVar246);
        auVar158._4_4_ = fVar172;
        auVar158._0_4_ = fVar170;
        fVar215 = (fVar212 * fVar168 - fVar183 * fVar130) * 0.0 +
                  (fVar183 * fVar247 - fVar239 * fVar168) * 0.0 +
                  (fVar239 * fVar130 - fVar212 * fVar247);
        fVar225 = (fVar214 * fVar169 - fVar185 * fVar133) * 0.0 +
                  (fVar185 * fVar257 - fVar226 * fVar169) * 0.0 +
                  (fVar226 * fVar133 - fVar214 * fVar257);
        auVar308._0_4_ =
             (fVar295 * fVar138 - fVar184 * fVar266) * 0.0 +
             (fVar184 * fVar241 - fVar282 * fVar138) * 0.0 + (fVar282 * fVar266 - fVar295 * fVar241)
        ;
        auVar308._4_4_ =
             (fVar297 * fVar145 - fVar186 * fVar269) * 0.0 +
             (fVar186 * fVar268 - fVar283 * fVar145) * 0.0 + (fVar283 * fVar269 - fVar297 * fVar268)
        ;
        auVar308._8_4_ =
             (fVar151 * fVar150 - fVar217 * fVar274) * 0.0 +
             (fVar217 * fVar271 - fVar284 * fVar150) * 0.0 + (fVar284 * fVar274 - fVar151 * fVar271)
        ;
        auVar308._12_4_ =
             (fVar164 * fVar163 - fVar223 * fVar281) * 0.0 +
             (fVar223 * fVar273 - fVar293 * fVar163) * 0.0 + (fVar293 * fVar281 - fVar164 * fVar273)
        ;
        auVar158._8_4_ = fVar215;
        auVar158._12_4_ = fVar225;
        auVar74 = maxps(auVar158,auVar308);
        bVar50 = auVar74._0_4_ <= 0.0 && bVar50;
        auVar159._0_4_ = -(uint)bVar50;
        bVar51 = auVar74._4_4_ <= 0.0 && bVar51;
        auVar159._4_4_ = -(uint)bVar51;
        bVar49 = auVar74._8_4_ <= 0.0 && bVar49;
        auVar159._8_4_ = -(uint)bVar49;
        bVar65 = auVar74._12_4_ <= 0.0 && bVar65;
        auVar159._12_4_ = -(uint)bVar65;
        iVar53 = movmskps(iVar53,auVar159);
        if (iVar53 == 0) {
LAB_00c31830:
          iVar53 = 0;
          auVar96._8_8_ = uStack_350;
          auVar96._0_8_ = local_358;
        }
        else {
          auVar176._0_4_ = fVar138 * fVar105;
          auVar176._4_4_ = fVar145 * fVar108;
          auVar176._8_4_ = fVar150 * fVar130;
          auVar176._12_4_ = fVar163 * fVar133;
          fVar282 = fVar266 * fVar165 - auVar176._0_4_;
          fVar283 = fVar269 * fVar167 - auVar176._4_4_;
          fVar284 = fVar274 * fVar168 - auVar176._8_4_;
          fVar293 = fVar281 * fVar169 - auVar176._12_4_;
          fVar138 = fVar138 * fVar243 - fVar165 * fVar241;
          fVar145 = fVar145 * fVar246 - fVar167 * fVar268;
          fVar150 = fVar150 * fVar247 - fVar168 * fVar271;
          fVar163 = fVar163 * fVar257 - fVar169 * fVar273;
          fVar105 = fVar241 * fVar105 - fVar266 * fVar243;
          fVar246 = fVar268 * fVar108 - fVar269 * fVar246;
          fVar247 = fVar271 * fVar130 - fVar274 * fVar247;
          fVar257 = fVar273 * fVar133 - fVar281 * fVar257;
          auVar207._0_4_ = fVar282 * 0.0 + fVar138 * 0.0 + fVar105;
          auVar207._4_4_ = fVar283 * 0.0 + fVar145 * 0.0 + fVar246;
          auVar207._8_4_ = fVar284 * 0.0 + fVar150 * 0.0 + fVar247;
          auVar207._12_4_ = fVar293 * 0.0 + fVar163 * 0.0 + fVar257;
          auVar74 = rcpps(auVar176,auVar207);
          fVar108 = auVar74._0_4_;
          fVar130 = auVar74._4_4_;
          fVar133 = auVar74._8_4_;
          fVar243 = auVar74._12_4_;
          fVar108 = (1.0 - auVar207._0_4_ * fVar108) * fVar108 + fVar108;
          fVar130 = (1.0 - auVar207._4_4_ * fVar130) * fVar130 + fVar130;
          fVar133 = (1.0 - auVar207._8_4_ * fVar133) * fVar133 + fVar133;
          fVar243 = (1.0 - auVar207._12_4_ * fVar243) * fVar243 + fVar243;
          fVar138 = (fVar166 * fVar105 + fVar187 * fVar138 + fVar228 * fVar282) * fVar108;
          fVar145 = (fVar171 * fVar246 + fVar189 * fVar145 + fVar236 * fVar283) * fVar130;
          fVar150 = (fVar183 * fVar247 + fVar212 * fVar150 + fVar239 * fVar284) * fVar133;
          fVar163 = (fVar185 * fVar257 + fVar214 * fVar163 + fVar226 * fVar293) * fVar243;
          fVar105 = *(float *)(ray + k * 4 + 0x80);
          bVar50 = (fVar138 <= fVar105 && fVar147 <= fVar138) && bVar50;
          auVar177._0_4_ = -(uint)bVar50;
          bVar51 = (fVar145 <= fVar105 && fVar147 <= fVar145) && bVar51;
          auVar177._4_4_ = -(uint)bVar51;
          bVar49 = (fVar150 <= fVar105 && fVar147 <= fVar150) && bVar49;
          auVar177._8_4_ = -(uint)bVar49;
          bVar65 = (fVar163 <= fVar105 && fVar147 <= fVar163) && bVar65;
          auVar177._12_4_ = -(uint)bVar65;
          iVar53 = movmskps(iVar53,auVar177);
          if (iVar53 == 0) goto LAB_00c31830;
          auVar178._0_8_ =
               CONCAT44(-(uint)(auVar207._4_4_ != 0.0 && bVar51),
                        -(uint)(auVar207._0_4_ != 0.0 && bVar50));
          auVar178._8_4_ = -(uint)(auVar207._8_4_ != 0.0 && bVar49);
          auVar178._12_4_ = -(uint)(auVar207._12_4_ != 0.0 && bVar65);
          iVar53 = movmskps(iVar53,auVar178);
          auVar96._8_8_ = uStack_350;
          auVar96._0_8_ = local_358;
          if (iVar53 != 0) {
            fVar170 = fVar170 * fVar108;
            fVar172 = fVar172 * fVar130;
            fVar215 = fVar215 * fVar133;
            fVar225 = fVar225 * fVar243;
            local_3b8 = (float)((uint)(1.0 - fVar170) & uVar67 | ~uVar67 & (uint)fVar170);
            fStack_3b4 = (float)((uint)(1.0 - fVar172) & uVar68 | ~uVar68 & (uint)fVar172);
            fStack_3b0 = (float)((uint)(1.0 - fVar215) & uVar69 | ~uVar69 & (uint)fVar215);
            fStack_3ac = (float)((uint)(1.0 - fVar225) & uVar70 | ~uVar70 & (uint)fVar225);
            local_278 = (float)(~uVar67 & (uint)(auVar308._0_4_ * fVar108) |
                               (uint)(1.0 - auVar308._0_4_ * fVar108) & uVar67);
            fStack_274 = (float)(~uVar68 & (uint)(auVar308._4_4_ * fVar130) |
                                (uint)(1.0 - auVar308._4_4_ * fVar130) & uVar68);
            fStack_270 = (float)(~uVar69 & (uint)(auVar308._8_4_ * fVar133) |
                                (uint)(1.0 - auVar308._8_4_ * fVar133) & uVar69);
            fStack_26c = (float)(~uVar70 & (uint)(auVar308._12_4_ * fVar243) |
                                (uint)(1.0 - auVar308._12_4_ * fVar243) & uVar70);
            auVar96._8_4_ = auVar178._8_4_;
            auVar96._0_8_ = auVar178._0_8_;
            auVar96._12_4_ = auVar178._12_4_;
            local_3c8 = fVar138;
            fStack_3c4 = fVar145;
            fStack_3c0 = fVar150;
            fStack_3bc = fVar163;
          }
        }
        iVar53 = movmskps(iVar53,auVar96);
        if (iVar53 == 0) goto LAB_00c30869;
        fVar300 = (fVar310 - fVar300) * local_3b8 + fVar300;
        fVar305 = (fVar312 - fVar305) * fStack_3b4 + fVar305;
        fVar306 = (fVar314 - fVar306) * fStack_3b0 + fVar306;
        fVar307 = (fVar316 - fVar307) * fStack_3ac + fVar307;
        fVar147 = *(float *)((long)local_320->ray_space + k * 4 + -0x10);
        auVar125._0_4_ = -(uint)(fVar147 * (fVar300 + fVar300) < local_3c8) & auVar96._0_4_;
        auVar125._4_4_ = -(uint)(fVar147 * (fVar305 + fVar305) < fStack_3c4) & auVar96._4_4_;
        auVar125._8_4_ = -(uint)(fVar147 * (fVar306 + fVar306) < fStack_3c0) & auVar96._8_4_;
        auVar125._12_4_ = -(uint)(fVar147 * (fVar307 + fVar307) < fStack_3bc) & auVar96._12_4_;
        uVar67 = movmskps((int)local_320,auVar125);
        if (uVar67 == 0) {
LAB_00c30861:
          bVar65 = false;
        }
        else {
          local_278 = local_278 + local_278 + -1.0;
          fStack_274 = fStack_274 + fStack_274 + -1.0;
          fStack_270 = fStack_270 + fStack_270 + -1.0;
          fStack_26c = fStack_26c + fStack_26c + -1.0;
          local_1f8 = 0;
          local_1e8 = CONCAT44(fStack_2c4,local_2c8);
          uStack_1e0 = CONCAT44(fStack_2bc,fStack_2c0);
          local_1d8 = CONCAT44(fVar256,fVar255);
          uStack_1d0 = CONCAT44(fStack_10c,fVar299);
          local_1c8 = CONCAT44(fVar238,fVar235);
          uStack_1c0 = CONCAT44(fStack_11c,fVar248);
          local_1b8 = CONCAT44(fVar216,fVar213);
          uStack_1b0 = CONCAT44(fStack_fc,fVar222);
          pRVar58 = (RTCIntersectArguments *)(ulong)*(uint *)(ray + k * 4 + 0x90);
          local_228 = local_3b8;
          fStack_224 = fStack_3b4;
          fStack_220 = fStack_3b0;
          fStack_21c = fStack_3ac;
          local_218 = local_278;
          fStack_214 = fStack_274;
          fStack_210 = fStack_270;
          fStack_20c = fStack_26c;
          local_208 = local_3c8;
          fStack_204 = fStack_3c4;
          fStack_200 = fStack_3c0;
          fStack_1fc = fStack_3bc;
          local_1f4 = iVar18;
          local_1a8 = auVar125;
          if ((pGVar19->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) goto LAB_00c30861;
          pRVar58 = context->args;
          if ((pRVar58->filter != (RTCFilterFunctionN)0x0) ||
             (bVar65 = true, pGVar19->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
            fVar73 = 1.0 / fVar73;
            local_198[0] = fVar73 * (local_3b8 + 0.0);
            local_198[1] = fVar73 * (fStack_3b4 + 1.0);
            local_198[2] = fVar73 * (fStack_3b0 + 2.0);
            local_198[3] = fVar73 * (fStack_3ac + 3.0);
            local_188 = CONCAT44(fStack_274,local_278);
            uStack_180 = CONCAT44(fStack_26c,fStack_270);
            local_178[0] = local_3c8;
            local_178[1] = fStack_3c4;
            local_178[2] = fStack_3c0;
            local_178[3] = fStack_3bc;
            pGVar61 = (Geometry *)(ulong)(uVar67 & 0xff);
            uVar64 = 0;
            if (pGVar61 != (Geometry *)0x0) {
              for (; ((uVar67 & 0xff) >> uVar64 & 1) == 0; uVar64 = uVar64 + 1) {
              }
            }
            local_488 = CONCAT44((undefined4)local_390,(undefined4)local_390);
            uStack_480._0_4_ = (undefined4)local_390;
            uStack_480._4_4_ = (undefined4)local_390;
            uVar47 = CONCAT44((undefined4)local_2d8,(undefined4)local_2d8);
            uVar48 = CONCAT44((undefined4)local_2d8,(undefined4)local_2d8);
            uVar107 = *(undefined8 *)*local_328;
            uVar24 = *(undefined8 *)(*local_328 + 8);
            bVar65 = true;
            do {
              local_c8 = local_198[uVar64];
              uVar57 = *(undefined4 *)(ray + k * 4 + 0x80);
              local_b8 = *(undefined4 *)((long)&local_188 + uVar64 * 4);
              *(float *)(ray + k * 4 + 0x80) = local_178[uVar64];
              fVar130 = 1.0 - local_c8;
              fVar147 = local_c8 * 3.0;
              fVar108 = ((fVar147 + 2.0) * (fVar130 + fVar130) + fVar130 * -3.0 * fVar130) * 0.5;
              fVar73 = (local_c8 * local_c8 + fVar130 * -2.0 * local_c8) * 0.5;
              fVar105 = (local_c8 * fVar147 + (fVar147 + -5.0) * (local_c8 + local_c8)) * 0.5;
              local_318.context = context->user;
              fVar147 = (local_c8 * (fVar130 + fVar130) - fVar130 * fVar130) * 0.5;
              local_f8 = fVar147 * local_2c8 +
                         fVar105 * fVar255 + fVar108 * fVar235 + fVar73 * fVar213;
              local_e8 = fVar147 * fStack_2c4 +
                         fVar105 * fVar256 + fVar108 * fVar238 + fVar73 * fVar216;
              local_d8 = fVar147 * fStack_2c0 +
                         fVar105 * fVar299 + fVar108 * fVar248 + fVar73 * fVar222;
              fStack_f4 = local_f8;
              fStack_f0 = local_f8;
              fStack_ec = local_f8;
              fStack_e4 = local_e8;
              fStack_e0 = local_e8;
              fStack_dc = local_e8;
              fStack_d4 = local_d8;
              fStack_d0 = local_d8;
              fStack_cc = local_d8;
              fStack_c4 = local_c8;
              fStack_c0 = local_c8;
              fStack_bc = local_c8;
              uStack_b4 = local_b8;
              uStack_b0 = local_b8;
              uStack_ac = local_b8;
              local_a8 = uVar47;
              uStack_a0 = uVar48;
              local_98 = local_488;
              uStack_90 = uStack_480;
              local_88 = (local_318.context)->instID[0];
              uStack_84 = local_88;
              uStack_80 = local_88;
              uStack_7c = local_88;
              local_78 = (local_318.context)->instPrimID[0];
              uStack_74 = local_78;
              uStack_70 = local_78;
              uStack_6c = local_78;
              local_318.valid = (int *)&local_3a8;
              pRVar58 = (RTCIntersectArguments *)pGVar19->userPtr;
              local_318.hit = (RTCHitN *)&local_f8;
              local_318.N = 4;
              p_Var55 = pGVar19->occlusionFilterN;
              local_3a8 = uVar107;
              uStack_3a0 = uVar24;
              local_318.geometryUserPtr = pRVar58;
              local_318.ray = (RTCRayN *)ray;
              if (p_Var55 != (RTCFilterFunctionN)0x0) {
                p_Var55 = (RTCFilterFunctionN)(*p_Var55)(&local_318);
              }
              auVar97._0_4_ = -(uint)((int)local_3a8 == 0);
              auVar97._4_4_ = -(uint)(local_3a8._4_4_ == 0);
              auVar97._8_4_ = -(uint)((int)uStack_3a0 == 0);
              auVar97._12_4_ = -(uint)(uStack_3a0._4_4_ == 0);
              uVar67 = movmskps((int)p_Var55,auVar97);
              pRVar56 = (RTCRayN *)(ulong)(uVar67 ^ 0xf);
              if ((uVar67 ^ 0xf) == 0) {
                auVar97 = auVar97 ^ _DAT_01febe20;
              }
              else {
                pRVar58 = context->args;
                if ((pRVar58->filter != (RTCFilterFunctionN)0x0) &&
                   (((pRVar58->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar19->field_8).field_0x2 & 0x40) != 0)))
                   ) {
                  (*pRVar58->filter)(&local_318);
                }
                auVar126._0_4_ = -(uint)((int)local_3a8 == 0);
                auVar126._4_4_ = -(uint)(local_3a8._4_4_ == 0);
                auVar126._8_4_ = -(uint)((int)uStack_3a0 == 0);
                auVar126._12_4_ = -(uint)(uStack_3a0._4_4_ == 0);
                auVar97 = auVar126 ^ _DAT_01febe20;
                *(undefined1 (*) [16])(local_318.ray + 0x80) =
                     ~auVar126 & _DAT_01feba00 |
                     *(undefined1 (*) [16])(local_318.ray + 0x80) & auVar126;
                pRVar56 = local_318.ray;
              }
              auVar98._0_4_ = auVar97._0_4_ << 0x1f;
              auVar98._4_4_ = auVar97._4_4_ << 0x1f;
              auVar98._8_4_ = auVar97._8_4_ << 0x1f;
              auVar98._12_4_ = auVar97._12_4_ << 0x1f;
              iVar53 = movmskps((int)pRVar56,auVar98);
              if (iVar53 != 0) break;
              *(undefined4 *)(ray + k * 4 + 0x80) = uVar57;
              pGVar61 = (Geometry *)((ulong)pGVar61 ^ 1L << (uVar64 & 0x3f));
              uVar64 = 0;
              if (pGVar61 != (Geometry *)0x0) {
                for (; ((ulong)pGVar61 >> uVar64 & 1) == 0; uVar64 = uVar64 + 1) {
                }
              }
              bVar65 = pGVar61 != (Geometry *)0x0;
            } while (bVar65);
          }
        }
      }
      uVar57 = SUB84(pRVar58,0);
      if (4 < iVar18) {
        local_58 = iVar18;
        iStack_54 = iVar18;
        iStack_50 = iVar18;
        iStack_4c = iVar18;
        local_2b8._4_4_ = local_2b8._0_4_;
        fStack_2b0 = (float)local_2b8._0_4_;
        fStack_2ac = (float)local_2b8._0_4_;
        local_68 = 1.0 / (float)local_2e8._0_4_;
        fStack_64 = local_68;
        fStack_60 = local_68;
        fStack_5c = local_68;
        local_2e8._4_4_ = (undefined4)local_390;
        local_2e8._0_4_ = (undefined4)local_390;
        local_2e8._8_4_ = (undefined4)local_390;
        local_2e8._12_4_ = (undefined4)local_390;
        local_2d8 = CONCAT44((undefined4)local_2d8,(undefined4)local_2d8);
        uStack_2d0 = (undefined4)local_2d8;
        uStack_2cc = (undefined4)local_2d8;
        lVar62 = 4;
        do {
          fVar300 = fStack_100;
          fVar297 = fStack_104;
          fVar295 = local_108;
          fVar293 = fStack_110;
          fVar284 = fStack_114;
          fVar283 = local_118;
          fVar282 = fStack_120;
          fVar281 = fStack_124;
          fVar274 = local_128;
          uVar68 = (uint)lVar62;
          puVar59 = catmullrom_basis0 + lVar22;
          pfVar1 = (float *)(puVar59 + lVar62 * 4);
          fVar147 = *pfVar1;
          fVar73 = pfVar1[1];
          fVar105 = pfVar1[2];
          fVar108 = pfVar1[3];
          pauVar8 = (undefined1 (*) [12])(lVar22 + 0x22307f0 + lVar62 * 4);
          fVar130 = *(float *)*pauVar8;
          fVar133 = *(float *)(*pauVar8 + 4);
          fVar138 = *(float *)(*pauVar8 + 8);
          auVar26 = *pauVar8;
          fVar145 = *(float *)pauVar8[1];
          pfVar1 = (float *)(lVar22 + 0x2230c74 + lVar62 * 4);
          fVar150 = *pfVar1;
          fVar163 = pfVar1[1];
          fVar166 = pfVar1[2];
          fVar171 = pfVar1[3];
          pfVar1 = (float *)(lVar22 + 0x22310f8 + lVar62 * 4);
          fVar183 = *pfVar1;
          fVar185 = pfVar1[1];
          fVar213 = pfVar1[2];
          fVar216 = pfVar1[3];
          fVar214 = local_348 * fVar147 +
                    local_248 * fVar130 + fVar224 * fVar150 + local_338 * fVar183;
          fVar215 = fStack_344 * fVar73 +
                    fStack_244 * fVar133 + fVar224 * fVar163 + fStack_334 * fVar185;
          fVar217 = fStack_340 * fVar105 +
                    fStack_240 * fVar138 + fVar224 * fVar166 + fStack_330 * fVar213;
          fVar223 = fStack_33c * fVar108 +
                    fStack_23c * fVar145 + fVar224 * fVar171 + fStack_32c * fVar216;
          fVar169 = local_258 * fVar147 +
                    local_2a8 * fVar130 + fVar227 * fVar150 + fVar106 * fVar183;
          fVar172 = fStack_254 * fVar73 +
                    fStack_2a4 * fVar133 + fVar227 * fVar163 + fVar106 * fVar185;
          fVar186 = fStack_250 * fVar105 +
                    fStack_2a0 * fVar138 + fVar227 * fVar166 + fVar106 * fVar213;
          fVar189 = fStack_24c * fVar108 +
                    fStack_29c * fVar145 + fVar227 * fVar171 + fVar106 * fVar216;
          auVar128._0_4_ =
               local_168 * fVar147 + local_158 * fVar130 + local_138 * fVar150 + local_148 * fVar183
          ;
          auVar128._4_4_ =
               fStack_164 * fVar73 +
               fStack_154 * fVar133 + fStack_134 * fVar163 + fStack_144 * fVar185;
          auVar128._8_4_ =
               fStack_160 * fVar105 +
               fStack_150 * fVar138 + fStack_130 * fVar166 + fStack_140 * fVar213;
          auVar128._12_4_ =
               fStack_15c * fVar108 +
               fStack_14c * fVar145 + fStack_12c * fVar171 + fStack_13c * fVar216;
          pfVar1 = (float *)(catmullrom_basis1 + lVar22 + lVar62 * 4);
          fVar130 = *pfVar1;
          fVar133 = pfVar1[1];
          fVar138 = pfVar1[2];
          fVar222 = pfVar1[3];
          pfVar1 = (float *)(lVar22 + 0x2232c10 + lVar62 * 4);
          fVar235 = *pfVar1;
          fVar238 = pfVar1[1];
          fVar248 = pfVar1[2];
          fVar255 = pfVar1[3];
          pfVar1 = (float *)(lVar22 + 0x2233094 + lVar62 * 4);
          fVar256 = *pfVar1;
          fVar299 = pfVar1[1];
          fVar243 = pfVar1[2];
          fVar246 = pfVar1[3];
          pfVar1 = (float *)(lVar22 + 0x2233518 + lVar62 * 4);
          fVar247 = *pfVar1;
          fVar257 = pfVar1[1];
          fVar266 = pfVar1[2];
          fVar269 = pfVar1[3];
          fVar305 = local_348 * fVar130 +
                    local_248 * fVar235 + fVar224 * fVar256 + local_338 * fVar247;
          fVar306 = fStack_344 * fVar133 +
                    fStack_244 * fVar238 + fVar224 * fVar299 + fStack_334 * fVar257;
          fVar307 = fStack_340 * fVar138 +
                    fStack_240 * fVar248 + fVar224 * fVar243 + fStack_330 * fVar266;
          fVar151 = fStack_33c * fVar222 +
                    fStack_23c * fVar255 + fVar224 * fVar246 + fStack_32c * fVar269;
          fVar164 = local_258 * fVar130 +
                    local_2a8 * fVar235 + fVar227 * fVar256 + fVar106 * fVar247;
          fVar165 = fStack_254 * fVar133 +
                    fStack_2a4 * fVar238 + fVar227 * fVar299 + fVar106 * fVar257;
          fVar167 = fStack_250 * fVar138 +
                    fStack_2a0 * fVar248 + fVar227 * fVar243 + fVar106 * fVar266;
          fVar168 = fStack_24c * fVar222 +
                    fStack_29c * fVar255 + fVar227 * fVar246 + fVar106 * fVar269;
          auVar160._0_4_ =
               local_168 * fVar130 + local_158 * fVar235 + local_138 * fVar256 + local_148 * fVar247
          ;
          auVar160._4_4_ =
               fStack_164 * fVar133 +
               fStack_154 * fVar238 + fStack_134 * fVar299 + fStack_144 * fVar257;
          auVar160._8_4_ =
               fStack_160 * fVar138 +
               fStack_150 * fVar248 + fStack_130 * fVar243 + fStack_140 * fVar266;
          auVar160._12_4_ =
               fStack_15c * fVar222 +
               fStack_14c * fVar255 + fStack_12c * fVar246 + fStack_13c * fVar269;
          fVar239 = fVar305 - fVar214;
          fVar241 = fVar306 - fVar215;
          fVar310 = fVar307 - fVar217;
          fVar312 = fVar151 - fVar223;
          fVar225 = fVar164 - fVar169;
          fVar226 = fVar165 - fVar172;
          fVar228 = fVar167 - fVar186;
          fVar236 = fVar168 - fVar189;
          fVar170 = fVar169 * fVar239 - fVar214 * fVar225;
          fVar184 = fVar172 * fVar241 - fVar215 * fVar226;
          fVar187 = fVar186 * fVar310 - fVar217 * fVar228;
          fVar212 = fVar189 * fVar312 - fVar223 * fVar236;
          auVar74 = maxps(auVar128,auVar160);
          bVar49 = fVar170 * fVar170 <=
                   auVar74._0_4_ * auVar74._0_4_ * (fVar239 * fVar239 + fVar225 * fVar225) &&
                   (int)uVar68 < local_58;
          auVar220._0_4_ = -(uint)bVar49;
          bVar50 = fVar184 * fVar184 <=
                   auVar74._4_4_ * auVar74._4_4_ * (fVar241 * fVar241 + fVar226 * fVar226) &&
                   (int)(uVar68 | 1) < iStack_54;
          auVar220._4_4_ = -(uint)bVar50;
          bVar51 = fVar187 * fVar187 <=
                   auVar74._8_4_ * auVar74._8_4_ * (fVar310 * fVar310 + fVar228 * fVar228) &&
                   (int)(uVar68 | 2) < iStack_50;
          auVar220._8_4_ = -(uint)bVar51;
          bVar52 = fVar212 * fVar212 <=
                   auVar74._12_4_ * auVar74._12_4_ * (fVar312 * fVar312 + fVar236 * fVar236) &&
                   (int)(uVar68 | 3) < iStack_4c;
          auVar220._12_4_ = -(uint)bVar52;
          uVar67 = movmskps((int)pGVar61,auVar220);
          pGVar61 = (Geometry *)(ulong)uVar67;
          if (uVar67 != 0) {
            fVar212 = fVar247 * local_298 + fVar256 * local_288 + fVar235 * fVar211 +
                      fVar130 * fVar188;
            fVar316 = fVar257 * fStack_294 + fVar299 * fStack_284 + fVar238 * fVar211 +
                      fVar133 * fVar188;
            fVar271 = fVar266 * fStack_290 + fVar243 * fStack_280 + fVar248 * fVar211 +
                      fVar138 * fVar188;
            fVar285 = fVar269 * fStack_28c + fVar246 * fStack_27c + fVar255 * fVar211 +
                      fVar222 * fVar188;
            local_428._0_4_ = auVar26._0_4_;
            local_428._4_4_ = auVar26._4_4_;
            uStack_420._0_4_ = auVar26._8_4_;
            fVar314 = fVar183 * local_298 + fVar150 * local_288 + (float)local_428 * fVar211 +
                      fVar147 * fVar188;
            fVar268 = fVar185 * fStack_294 + fVar163 * fStack_284 + local_428._4_4_ * fVar211 +
                      fVar73 * fVar188;
            fVar273 = fVar213 * fStack_290 + fVar166 * fStack_280 + (float)uStack_420 * fVar211 +
                      fVar105 * fVar188;
            fVar294 = fVar216 * fStack_28c + fVar171 * fStack_27c + fVar145 * fVar211 +
                      fVar108 * fVar188;
            pfVar1 = (float *)(lVar22 + 0x223157c + lVar62 * 4);
            fVar147 = *pfVar1;
            fVar73 = pfVar1[1];
            fVar105 = pfVar1[2];
            fVar108 = pfVar1[3];
            pfVar1 = (float *)(lVar22 + 0x2231a00 + lVar62 * 4);
            fVar130 = *pfVar1;
            fVar133 = pfVar1[1];
            fVar138 = pfVar1[2];
            fVar145 = pfVar1[3];
            pfVar1 = (float *)(lVar22 + 0x2231e84 + lVar62 * 4);
            fVar150 = *pfVar1;
            fVar163 = pfVar1[1];
            fVar166 = pfVar1[2];
            fVar171 = pfVar1[3];
            pfVar1 = (float *)(lVar22 + 0x2232308 + lVar62 * 4);
            fVar183 = *pfVar1;
            fVar185 = pfVar1[1];
            fVar213 = pfVar1[2];
            fVar216 = pfVar1[3];
            fVar136 = local_348 * fVar147 +
                      local_248 * fVar130 + fVar224 * fVar150 + local_338 * fVar183;
            fVar137 = fStack_344 * fVar73 +
                      fStack_244 * fVar133 + fVar224 * fVar163 + fStack_334 * fVar185;
            fVar139 = fStack_340 * fVar105 +
                      fStack_240 * fVar138 + fVar224 * fVar166 + fStack_330 * fVar213;
            fVar146 = fStack_33c * fVar108 +
                      fStack_23c * fVar145 + fVar224 * fVar171 + fStack_32c * fVar216;
            fVar296 = local_258 * fVar147 +
                      local_2a8 * fVar130 + fVar227 * fVar150 + fVar106 * fVar183;
            fVar298 = fStack_254 * fVar73 +
                      fStack_2a4 * fVar133 + fVar227 * fVar163 + fVar106 * fVar185;
            fVar109 = fStack_250 * fVar105 +
                      fStack_2a0 * fVar138 + fVar227 * fVar166 + fVar106 * fVar213;
            fVar110 = fStack_24c * fVar108 +
                      fStack_29c * fVar145 + fVar227 * fVar171 + fVar106 * fVar216;
            pfVar1 = (float *)(lVar22 + 0x223399c + lVar62 * 4);
            fVar222 = *pfVar1;
            fVar235 = pfVar1[1];
            fVar238 = pfVar1[2];
            fVar248 = pfVar1[3];
            pfVar1 = (float *)(lVar22 + 0x22342a4 + lVar62 * 4);
            fVar255 = *pfVar1;
            fVar256 = pfVar1[1];
            fVar299 = pfVar1[2];
            fVar243 = pfVar1[3];
            pfVar1 = (float *)(lVar22 + 0x2234728 + lVar62 * 4);
            fVar246 = *pfVar1;
            fVar247 = pfVar1[1];
            fVar257 = pfVar1[2];
            fVar266 = pfVar1[3];
            pfVar1 = (float *)(lVar22 + 0x2233e20 + lVar62 * 4);
            fVar269 = *pfVar1;
            fVar170 = pfVar1[1];
            fVar184 = pfVar1[2];
            fVar187 = pfVar1[3];
            fVar148 = local_348 * fVar222 +
                      local_248 * fVar269 + fVar224 * fVar255 + local_338 * fVar246;
            fVar149 = fStack_344 * fVar235 +
                      fStack_244 * fVar170 + fVar224 * fVar256 + fStack_334 * fVar247;
            fVar229 = fStack_340 * fVar238 +
                      fStack_240 * fVar184 + fVar224 * fVar299 + fStack_330 * fVar257;
            fVar237 = fStack_33c * fVar248 +
                      fStack_23c * fVar187 + fVar224 * fVar243 + fStack_32c * fVar266;
            fVar131 = local_258 * fVar222 +
                      local_2a8 * fVar269 + fVar227 * fVar255 + fVar106 * fVar246;
            fVar132 = fStack_254 * fVar235 +
                      fStack_2a4 * fVar170 + fVar227 * fVar256 + fVar106 * fVar247;
            fVar134 = fStack_250 * fVar238 +
                      fStack_2a0 * fVar184 + fVar227 * fVar299 + fVar106 * fVar257;
            fVar135 = fStack_24c * fVar248 +
                      fStack_29c * fVar187 + fVar227 * fVar243 + fVar106 * fVar266;
            auVar292._0_8_ = CONCAT44(fVar137,fVar136) & 0x7fffffff7fffffff;
            auVar292._8_4_ = ABS(fVar139);
            auVar292._12_4_ = ABS(fVar146);
            auVar208._0_8_ = CONCAT44(fVar298,fVar296) & 0x7fffffff7fffffff;
            auVar208._8_4_ = ABS(fVar109);
            auVar208._12_4_ = ABS(fVar110);
            auVar74 = maxps(auVar292,auVar208);
            auVar303._0_8_ =
                 CONCAT44(fVar73 * fVar188 +
                          fVar133 * fVar211 + fVar163 * fStack_284 + fVar185 * fStack_294,
                          fVar147 * fVar188 +
                          fVar130 * fVar211 + fVar150 * local_288 + fVar183 * local_298) &
                 0x7fffffff7fffffff;
            auVar303._8_4_ =
                 ABS(fVar105 * fVar188 +
                     fVar138 * fVar211 + fVar166 * fStack_280 + fVar213 * fStack_290);
            auVar303._12_4_ =
                 ABS(fVar108 * fVar188 +
                     fVar145 * fVar211 + fVar171 * fStack_27c + fVar216 * fStack_28c);
            auVar74 = maxps(auVar74,auVar303);
            uVar67 = -(uint)(local_448 <= auVar74._0_4_);
            uVar69 = -(uint)(local_448 <= auVar74._4_4_);
            uVar70 = -(uint)(local_448 <= auVar74._8_4_);
            uVar71 = -(uint)(local_448 <= auVar74._12_4_);
            auVar209._0_4_ = ~uVar67 & (uint)fVar239;
            auVar209._4_4_ = ~uVar69 & (uint)fVar241;
            auVar209._8_4_ = ~uVar70 & (uint)fVar310;
            auVar209._12_4_ = ~uVar71 & (uint)fVar312;
            auVar280._0_4_ = (uint)fVar136 & uVar67;
            auVar280._4_4_ = (uint)fVar137 & uVar69;
            auVar280._8_4_ = (uint)fVar139 & uVar70;
            auVar280._12_4_ = (uint)fVar146 & uVar71;
            auVar280 = auVar280 | auVar209;
            fVar163 = (float)(~uVar67 & (uint)fVar225 | (uint)fVar296 & uVar67);
            fVar171 = (float)(~uVar69 & (uint)fVar226 | (uint)fVar298 & uVar69);
            fVar298 = (float)(~uVar70 & (uint)fVar228 | (uint)fVar109 & uVar70);
            fVar110 = (float)(~uVar71 & (uint)fVar236 | (uint)fVar110 & uVar71);
            auVar304._0_8_ = CONCAT44(fVar149,fVar148) & 0x7fffffff7fffffff;
            auVar304._8_4_ = ABS(fVar229);
            auVar304._12_4_ = ABS(fVar237);
            auVar142._0_8_ = CONCAT44(fVar132,fVar131) & 0x7fffffff7fffffff;
            auVar142._8_4_ = ABS(fVar134);
            auVar142._12_4_ = ABS(fVar135);
            auVar74 = maxps(auVar304,auVar142);
            auVar99._0_8_ =
                 CONCAT44(fVar235 * fVar188 +
                          fVar170 * fVar211 + fVar256 * fStack_284 + fVar247 * fStack_294,
                          fVar222 * fVar188 +
                          fVar269 * fVar211 + fVar255 * local_288 + fVar246 * local_298) &
                 0x7fffffff7fffffff;
            auVar99._8_4_ =
                 ABS(fVar238 * fVar188 +
                     fVar184 * fVar211 + fVar299 * fStack_280 + fVar257 * fStack_290);
            auVar99._12_4_ =
                 ABS(fVar248 * fVar188 +
                     fVar187 * fVar211 + fVar243 * fStack_27c + fVar266 * fStack_28c);
            auVar74 = maxps(auVar74,auVar99);
            uVar67 = -(uint)(local_448 <= auVar74._0_4_);
            uVar69 = -(uint)(local_448 <= auVar74._4_4_);
            uVar70 = -(uint)(local_448 <= auVar74._8_4_);
            uVar71 = -(uint)(local_448 <= auVar74._12_4_);
            fVar255 = (float)((uint)fVar148 & uVar67 | ~uVar67 & (uint)fVar239);
            fVar256 = (float)((uint)fVar149 & uVar69 | ~uVar69 & (uint)fVar241);
            fVar299 = (float)((uint)fVar229 & uVar70 | ~uVar70 & (uint)fVar310);
            fVar243 = (float)((uint)fVar237 & uVar71 | ~uVar71 & (uint)fVar312);
            fVar222 = (float)(~uVar67 & (uint)fVar225 | (uint)fVar131 & uVar67);
            fVar235 = (float)(~uVar69 & (uint)fVar226 | (uint)fVar132 & uVar69);
            fVar238 = (float)(~uVar70 & (uint)fVar228 | (uint)fVar134 & uVar70);
            fVar248 = (float)(~uVar71 & (uint)fVar236 | (uint)fVar135 & uVar71);
            fVar145 = auVar280._0_4_;
            fVar147 = auVar280._4_4_;
            fVar73 = auVar280._8_4_;
            fVar105 = auVar280._12_4_;
            auVar179._0_4_ = fVar163 * fVar163 + fVar145 * fVar145;
            auVar179._4_4_ = fVar171 * fVar171 + fVar147 * fVar147;
            auVar179._8_4_ = fVar298 * fVar298 + fVar73 * fVar73;
            auVar179._12_4_ = fVar110 * fVar110 + fVar105 * fVar105;
            auVar74 = rsqrtps(auVar209,auVar179);
            fVar108 = auVar74._0_4_;
            fVar130 = auVar74._4_4_;
            fVar133 = auVar74._8_4_;
            fVar138 = auVar74._12_4_;
            auVar210._0_4_ = fVar108 * fVar108 * auVar179._0_4_ * 0.5 * fVar108;
            auVar210._4_4_ = fVar130 * fVar130 * auVar179._4_4_ * 0.5 * fVar130;
            auVar210._8_4_ = fVar133 * fVar133 * auVar179._8_4_ * 0.5 * fVar133;
            auVar210._12_4_ = fVar138 * fVar138 * auVar179._12_4_ * 0.5 * fVar138;
            fVar183 = fVar108 * 1.5 - auVar210._0_4_;
            fVar185 = fVar130 * 1.5 - auVar210._4_4_;
            fVar213 = fVar133 * 1.5 - auVar210._8_4_;
            fVar216 = fVar138 * 1.5 - auVar210._12_4_;
            auVar180._0_4_ = fVar222 * fVar222 + fVar255 * fVar255;
            auVar180._4_4_ = fVar235 * fVar235 + fVar256 * fVar256;
            auVar180._8_4_ = fVar238 * fVar238 + fVar299 * fVar299;
            auVar180._12_4_ = fVar248 * fVar248 + fVar243 * fVar243;
            auVar74 = rsqrtps(auVar210,auVar180);
            fVar108 = auVar74._0_4_;
            fVar130 = auVar74._4_4_;
            fVar133 = auVar74._8_4_;
            fVar138 = auVar74._12_4_;
            fVar150 = fVar108 * 1.5 - fVar108 * fVar108 * auVar180._0_4_ * 0.5 * fVar108;
            fVar130 = fVar130 * 1.5 - fVar130 * fVar130 * auVar180._4_4_ * 0.5 * fVar130;
            fVar166 = fVar133 * 1.5 - fVar133 * fVar133 * auVar180._8_4_ * 0.5 * fVar133;
            fVar138 = fVar138 * 1.5 - fVar138 * fVar138 * auVar180._12_4_ * 0.5 * fVar138;
            fVar296 = fVar163 * fVar183 * auVar128._0_4_;
            fVar109 = fVar171 * fVar185 * auVar128._4_4_;
            fVar131 = fVar298 * fVar213 * auVar128._8_4_;
            fVar134 = fVar110 * fVar216 * auVar128._12_4_;
            fVar133 = -fVar145 * fVar183 * auVar128._0_4_;
            fVar145 = -fVar147 * fVar185 * auVar128._4_4_;
            fVar163 = -fVar73 * fVar213 * auVar128._8_4_;
            fVar171 = -fVar105 * fVar216 * auVar128._12_4_;
            fVar246 = fVar183 * 0.0 * auVar128._0_4_;
            fVar247 = fVar185 * 0.0 * auVar128._4_4_;
            fVar257 = fVar213 * 0.0 * auVar128._8_4_;
            fVar266 = fVar216 * 0.0 * auVar128._12_4_;
            fVar136 = fVar222 * fVar150 * auVar160._0_4_;
            fVar137 = fVar235 * fVar130 * auVar160._4_4_;
            fVar139 = fVar238 * fVar166 * auVar160._8_4_;
            fVar146 = fVar248 * fVar138 * auVar160._12_4_;
            fVar183 = fVar305 + fVar136;
            fVar185 = fVar306 + fVar137;
            fVar213 = fVar307 + fVar139;
            fVar216 = fVar151 + fVar146;
            fVar147 = -fVar255 * fVar150 * auVar160._0_4_;
            fVar73 = -fVar256 * fVar130 * auVar160._4_4_;
            fVar105 = -fVar299 * fVar166 * auVar160._8_4_;
            fVar108 = -fVar243 * fVar138 * auVar160._12_4_;
            fVar239 = fVar164 + fVar147;
            fVar241 = fVar165 + fVar73;
            fVar310 = fVar167 + fVar105;
            fVar312 = fVar168 + fVar108;
            fVar235 = fVar150 * 0.0 * auVar160._0_4_;
            fVar248 = fVar130 * 0.0 * auVar160._4_4_;
            fVar256 = fVar166 * 0.0 * auVar160._8_4_;
            fVar243 = fVar138 * 0.0 * auVar160._12_4_;
            fVar222 = fVar214 - fVar296;
            fVar238 = fVar215 - fVar109;
            fVar255 = fVar217 - fVar131;
            fVar299 = fVar223 - fVar134;
            fVar298 = fVar212 + fVar235;
            fVar110 = fVar316 + fVar248;
            fVar132 = fVar271 + fVar256;
            fVar135 = fVar285 + fVar243;
            fVar269 = fVar169 - fVar133;
            fVar170 = fVar172 - fVar145;
            fVar184 = fVar186 - fVar163;
            fVar187 = fVar189 - fVar171;
            fVar130 = fVar314 - fVar246;
            fVar138 = fVar268 - fVar247;
            fVar150 = fVar273 - fVar257;
            fVar166 = fVar294 - fVar266;
            uVar67 = -(uint)(0.0 < (fVar269 * (fVar298 - fVar130) - fVar130 * (fVar239 - fVar269)) *
                                   0.0 + (fVar130 * (fVar183 - fVar222) -
                                         (fVar298 - fVar130) * fVar222) * 0.0 +
                                         ((fVar239 - fVar269) * fVar222 -
                                         (fVar183 - fVar222) * fVar269));
            uVar69 = -(uint)(0.0 < (fVar170 * (fVar110 - fVar138) - fVar138 * (fVar241 - fVar170)) *
                                   0.0 + (fVar138 * (fVar185 - fVar238) -
                                         (fVar110 - fVar138) * fVar238) * 0.0 +
                                         ((fVar241 - fVar170) * fVar238 -
                                         (fVar185 - fVar238) * fVar170));
            uVar70 = -(uint)(0.0 < (fVar184 * (fVar132 - fVar150) - fVar150 * (fVar310 - fVar184)) *
                                   0.0 + (fVar150 * (fVar213 - fVar255) -
                                         (fVar132 - fVar150) * fVar255) * 0.0 +
                                         ((fVar310 - fVar184) * fVar255 -
                                         (fVar213 - fVar255) * fVar184));
            uVar71 = -(uint)(0.0 < (fVar187 * (fVar135 - fVar166) - fVar166 * (fVar312 - fVar187)) *
                                   0.0 + (fVar166 * (fVar216 - fVar299) -
                                         (fVar135 - fVar166) * fVar299) * 0.0 +
                                         ((fVar312 - fVar187) * fVar299 -
                                         (fVar216 - fVar299) * fVar187));
            fVar214 = (float)((uint)(fVar305 - fVar136) & uVar67 |
                             ~uVar67 & (uint)(fVar214 + fVar296));
            fVar215 = (float)((uint)(fVar306 - fVar137) & uVar69 |
                             ~uVar69 & (uint)(fVar215 + fVar109));
            fVar217 = (float)((uint)(fVar307 - fVar139) & uVar70 |
                             ~uVar70 & (uint)(fVar217 + fVar131));
            fVar223 = (float)((uint)(fVar151 - fVar146) & uVar71 |
                             ~uVar71 & (uint)(fVar223 + fVar134));
            fVar296 = (float)((uint)(fVar164 - fVar147) & uVar67 |
                             ~uVar67 & (uint)(fVar169 + fVar133));
            fVar109 = (float)((uint)(fVar165 - fVar73) & uVar69 |
                             ~uVar69 & (uint)(fVar172 + fVar145));
            fVar186 = (float)((uint)(fVar167 - fVar105) & uVar70 |
                             ~uVar70 & (uint)(fVar186 + fVar163));
            fVar189 = (float)((uint)(fVar168 - fVar108) & uVar71 |
                             ~uVar71 & (uint)(fVar189 + fVar171));
            fVar246 = (float)((uint)(fVar212 - fVar235) & uVar67 |
                             ~uVar67 & (uint)(fVar314 + fVar246));
            fVar247 = (float)((uint)(fVar316 - fVar248) & uVar69 |
                             ~uVar69 & (uint)(fVar268 + fVar247));
            fVar257 = (float)((uint)(fVar271 - fVar256) & uVar70 |
                             ~uVar70 & (uint)(fVar273 + fVar257));
            fVar266 = (float)((uint)(fVar285 - fVar243) & uVar71 |
                             ~uVar71 & (uint)(fVar294 + fVar266));
            fVar235 = (float)((uint)fVar222 & uVar67 | ~uVar67 & (uint)fVar183);
            fVar248 = (float)((uint)fVar238 & uVar69 | ~uVar69 & (uint)fVar185);
            fVar256 = (float)((uint)fVar255 & uVar70 | ~uVar70 & (uint)fVar213);
            fVar243 = (float)((uint)fVar299 & uVar71 | ~uVar71 & (uint)fVar216);
            fVar305 = (float)((uint)fVar269 & uVar67 | ~uVar67 & (uint)fVar239);
            fVar306 = (float)((uint)fVar170 & uVar69 | ~uVar69 & (uint)fVar241);
            fVar307 = (float)((uint)fVar184 & uVar70 | ~uVar70 & (uint)fVar310);
            fVar151 = (float)((uint)fVar187 & uVar71 | ~uVar71 & (uint)fVar312);
            fVar133 = (float)((uint)fVar130 & uVar67 | ~uVar67 & (uint)fVar298);
            fVar145 = (float)((uint)fVar138 & uVar69 | ~uVar69 & (uint)fVar110);
            fVar163 = (float)((uint)fVar150 & uVar70 | ~uVar70 & (uint)fVar132);
            fVar171 = (float)((uint)fVar166 & uVar71 | ~uVar71 & (uint)fVar135);
            fVar183 = (float)((uint)fVar183 & uVar67 | ~uVar67 & (uint)fVar222) - fVar214;
            fVar185 = (float)((uint)fVar185 & uVar69 | ~uVar69 & (uint)fVar238) - fVar215;
            fVar213 = (float)((uint)fVar213 & uVar70 | ~uVar70 & (uint)fVar255) - fVar217;
            fVar216 = (float)((uint)fVar216 & uVar71 | ~uVar71 & (uint)fVar299) - fVar223;
            fVar222 = (float)((uint)fVar239 & uVar67 | ~uVar67 & (uint)fVar269) - fVar296;
            fVar238 = (float)((uint)fVar241 & uVar69 | ~uVar69 & (uint)fVar170) - fVar109;
            fVar255 = (float)((uint)fVar310 & uVar70 | ~uVar70 & (uint)fVar184) - fVar186;
            fVar299 = (float)((uint)fVar312 & uVar71 | ~uVar71 & (uint)fVar187) - fVar189;
            fVar269 = (float)((uint)fVar298 & uVar67 | ~uVar67 & (uint)fVar130) - fVar246;
            fVar164 = (float)((uint)fVar110 & uVar69 | ~uVar69 & (uint)fVar138) - fVar247;
            fVar165 = (float)((uint)fVar132 & uVar70 | ~uVar70 & (uint)fVar150) - fVar257;
            fVar167 = (float)((uint)fVar135 & uVar71 | ~uVar71 & (uint)fVar166) - fVar266;
            fVar184 = fVar214 - fVar235;
            fVar187 = fVar215 - fVar248;
            fVar212 = fVar217 - fVar256;
            fVar239 = fVar223 - fVar243;
            fVar147 = fVar296 - fVar305;
            fVar73 = fVar109 - fVar306;
            fVar105 = fVar186 - fVar307;
            fVar108 = fVar189 - fVar151;
            fVar130 = fVar246 - fVar133;
            fVar138 = fVar247 - fVar145;
            fVar150 = fVar257 - fVar163;
            fVar166 = fVar266 - fVar171;
            fVar168 = (fVar296 * fVar269 - fVar246 * fVar222) * 0.0 +
                      (fVar246 * fVar183 - fVar214 * fVar269) * 0.0 +
                      (fVar214 * fVar222 - fVar296 * fVar183);
            fVar169 = (fVar109 * fVar164 - fVar247 * fVar238) * 0.0 +
                      (fVar247 * fVar185 - fVar215 * fVar164) * 0.0 +
                      (fVar215 * fVar238 - fVar109 * fVar185);
            auVar161._4_4_ = fVar169;
            auVar161._0_4_ = fVar168;
            fVar170 = (fVar186 * fVar165 - fVar257 * fVar255) * 0.0 +
                      (fVar257 * fVar213 - fVar217 * fVar165) * 0.0 +
                      (fVar217 * fVar255 - fVar186 * fVar213);
            fVar172 = (fVar189 * fVar167 - fVar266 * fVar299) * 0.0 +
                      (fVar266 * fVar216 - fVar223 * fVar167) * 0.0 +
                      (fVar223 * fVar299 - fVar189 * fVar216);
            auVar309._0_4_ =
                 (fVar305 * fVar130 - fVar133 * fVar147) * 0.0 +
                 (fVar133 * fVar184 - fVar235 * fVar130) * 0.0 +
                 (fVar235 * fVar147 - fVar305 * fVar184);
            auVar309._4_4_ =
                 (fVar306 * fVar138 - fVar145 * fVar73) * 0.0 +
                 (fVar145 * fVar187 - fVar248 * fVar138) * 0.0 +
                 (fVar248 * fVar73 - fVar306 * fVar187);
            auVar309._8_4_ =
                 (fVar307 * fVar150 - fVar163 * fVar105) * 0.0 +
                 (fVar163 * fVar212 - fVar256 * fVar150) * 0.0 +
                 (fVar256 * fVar105 - fVar307 * fVar212);
            auVar309._12_4_ =
                 (fVar151 * fVar166 - fVar171 * fVar108) * 0.0 +
                 (fVar171 * fVar239 - fVar243 * fVar166) * 0.0 +
                 (fVar243 * fVar108 - fVar151 * fVar239);
            auVar161._8_4_ = fVar170;
            auVar161._12_4_ = fVar172;
            auVar74 = maxps(auVar161,auVar309);
            bVar49 = auVar74._0_4_ <= 0.0 && bVar49;
            auVar162._0_4_ = -(uint)bVar49;
            bVar50 = auVar74._4_4_ <= 0.0 && bVar50;
            auVar162._4_4_ = -(uint)bVar50;
            bVar51 = auVar74._8_4_ <= 0.0 && bVar51;
            auVar162._8_4_ = -(uint)bVar51;
            bVar52 = auVar74._12_4_ <= 0.0 && bVar52;
            auVar162._12_4_ = -(uint)bVar52;
            iVar53 = movmskps((int)(catmullrom_basis1 + lVar22),auVar162);
            if (iVar53 == 0) {
LAB_00c317e6:
              auVar144._8_8_ = uStack_350;
              auVar144._0_8_ = local_358;
            }
            else {
              fVar163 = fVar147 * fVar269 - fVar130 * fVar222;
              fVar171 = fVar73 * fVar164 - fVar138 * fVar238;
              fVar235 = fVar105 * fVar165 - fVar150 * fVar255;
              fVar248 = fVar108 * fVar167 - fVar166 * fVar299;
              fVar133 = fVar130 * fVar183 - fVar269 * fVar184;
              fVar138 = fVar138 * fVar185 - fVar164 * fVar187;
              fVar145 = fVar150 * fVar213 - fVar165 * fVar212;
              fVar150 = fVar166 * fVar216 - fVar167 * fVar239;
              fVar147 = fVar184 * fVar222 - fVar147 * fVar183;
              fVar166 = fVar187 * fVar238 - fVar73 * fVar185;
              fVar183 = fVar212 * fVar255 - fVar105 * fVar213;
              fVar185 = fVar239 * fVar299 - fVar108 * fVar216;
              auVar143._0_4_ = fVar133 * 0.0 + fVar147;
              auVar143._4_4_ = fVar138 * 0.0 + fVar166;
              auVar143._8_4_ = fVar145 * 0.0 + fVar183;
              auVar143._12_4_ = fVar150 * 0.0 + fVar185;
              auVar221._0_4_ = fVar163 * 0.0 + auVar143._0_4_;
              auVar221._4_4_ = fVar171 * 0.0 + auVar143._4_4_;
              auVar221._8_4_ = fVar235 * 0.0 + auVar143._8_4_;
              auVar221._12_4_ = fVar248 * 0.0 + auVar143._12_4_;
              auVar74 = rcpps(auVar143,auVar221);
              fVar73 = auVar74._0_4_;
              fVar105 = auVar74._4_4_;
              fVar108 = auVar74._8_4_;
              fVar130 = auVar74._12_4_;
              fVar73 = (1.0 - auVar221._0_4_ * fVar73) * fVar73 + fVar73;
              fVar105 = (1.0 - auVar221._4_4_ * fVar105) * fVar105 + fVar105;
              fVar108 = (1.0 - auVar221._8_4_ * fVar108) * fVar108 + fVar108;
              fVar130 = (1.0 - auVar221._12_4_ * fVar130) * fVar130 + fVar130;
              fVar133 = (fVar246 * fVar147 + fVar296 * fVar133 + fVar214 * fVar163) * fVar73;
              fVar138 = (fVar247 * fVar166 + fVar109 * fVar138 + fVar215 * fVar171) * fVar105;
              fVar145 = (fVar257 * fVar183 + fVar186 * fVar145 + fVar217 * fVar235) * fVar108;
              fVar150 = (fVar266 * fVar185 + fVar189 * fVar150 + fVar223 * fVar248) * fVar130;
              fVar147 = *(float *)(ray + k * 4 + 0x80);
              bVar49 = ((float)local_2b8._0_4_ <= fVar133 && fVar133 <= fVar147) && bVar49;
              auVar181._0_4_ = -(uint)bVar49;
              bVar50 = ((float)local_2b8._4_4_ <= fVar138 && fVar138 <= fVar147) && bVar50;
              auVar181._4_4_ = -(uint)bVar50;
              bVar51 = (fStack_2b0 <= fVar145 && fVar145 <= fVar147) && bVar51;
              auVar181._8_4_ = -(uint)bVar51;
              bVar52 = (fStack_2ac <= fVar150 && fVar150 <= fVar147) && bVar52;
              auVar181._12_4_ = -(uint)bVar52;
              iVar53 = movmskps(iVar53,auVar181);
              if (iVar53 == 0) goto LAB_00c317e6;
              auVar182._0_8_ =
                   CONCAT44(-(uint)(auVar221._4_4_ != 0.0 && bVar50),
                            -(uint)(auVar221._0_4_ != 0.0 && bVar49));
              auVar182._8_4_ = -(uint)(auVar221._8_4_ != 0.0 && bVar51);
              auVar182._12_4_ = -(uint)(auVar221._12_4_ != 0.0 && bVar52);
              iVar53 = movmskps(iVar53,auVar182);
              auVar144._8_8_ = uStack_350;
              auVar144._0_8_ = local_358;
              if (iVar53 != 0) {
                fVar168 = fVar168 * fVar73;
                fVar169 = fVar169 * fVar105;
                fVar170 = fVar170 * fVar108;
                fVar172 = fVar172 * fVar130;
                local_368 = (float)((uint)(1.0 - fVar168) & uVar67 | ~uVar67 & (uint)fVar168);
                fStack_364 = (float)((uint)(1.0 - fVar169) & uVar69 | ~uVar69 & (uint)fVar169);
                fStack_360 = (float)((uint)(1.0 - fVar170) & uVar70 | ~uVar70 & (uint)fVar170);
                fStack_35c = (float)((uint)(1.0 - fVar172) & uVar71 | ~uVar71 & (uint)fVar172);
                local_378 = (float)(~uVar67 & (uint)(auVar309._0_4_ * fVar73) |
                                   (uint)(1.0 - auVar309._0_4_ * fVar73) & uVar67);
                fStack_374 = (float)(~uVar69 & (uint)(auVar309._4_4_ * fVar105) |
                                    (uint)(1.0 - auVar309._4_4_ * fVar105) & uVar69);
                fStack_370 = (float)(~uVar70 & (uint)(auVar309._8_4_ * fVar108) |
                                    (uint)(1.0 - auVar309._8_4_ * fVar108) & uVar70);
                fStack_36c = (float)(~uVar71 & (uint)(auVar309._12_4_ * fVar130) |
                                    (uint)(1.0 - auVar309._12_4_ * fVar130) & uVar71);
                auVar144._8_4_ = auVar182._8_4_;
                auVar144._0_8_ = auVar182._0_8_;
                auVar144._12_4_ = auVar182._12_4_;
                local_388 = fVar133;
                fStack_384 = fVar138;
                fStack_380 = fVar145;
                fStack_37c = fVar150;
              }
            }
            iVar53 = movmskps(iVar53,auVar144);
            local_268 = fVar225;
            fStack_264 = fVar226;
            fStack_260 = fVar228;
            fStack_25c = fVar236;
            if (iVar53 != 0) {
              fVar73 = (auVar160._0_4_ - auVar128._0_4_) * local_368 + auVar128._0_4_;
              fVar105 = (auVar160._4_4_ - auVar128._4_4_) * fStack_364 + auVar128._4_4_;
              fVar108 = (auVar160._8_4_ - auVar128._8_4_) * fStack_360 + auVar128._8_4_;
              fVar130 = (auVar160._12_4_ - auVar128._12_4_) * fStack_35c + auVar128._12_4_;
              fVar147 = *(float *)((long)local_320->ray_space + k * 4 + -0x10);
              auVar100._0_4_ = -(uint)(fVar147 * (fVar73 + fVar73) < local_388) & auVar144._0_4_;
              auVar100._4_4_ = -(uint)(fVar147 * (fVar105 + fVar105) < fStack_384) & auVar144._4_4_;
              auVar100._8_4_ = -(uint)(fVar147 * (fVar108 + fVar108) < fStack_380) & auVar144._8_4_;
              auVar100._12_4_ =
                   -(uint)(fVar147 * (fVar130 + fVar130) < fStack_37c) & auVar144._12_4_;
              uVar67 = movmskps((int)local_320,auVar100);
              if (uVar67 != 0) {
                local_378 = local_378 + local_378 + -1.0;
                fStack_374 = fStack_374 + fStack_374 + -1.0;
                fStack_370 = fStack_370 + fStack_370 + -1.0;
                fStack_36c = fStack_36c + fStack_36c + -1.0;
                local_1e8 = CONCAT44(fStack_2c4,local_2c8);
                uStack_1e0 = CONCAT44(fStack_2bc,fStack_2c0);
                local_1d8 = CONCAT44(fStack_114,local_118);
                uStack_1d0 = CONCAT44(fStack_10c,fStack_110);
                local_1c8 = CONCAT44(fStack_124,local_128);
                uStack_1c0 = CONCAT44(fStack_11c,fStack_120);
                local_1b8 = CONCAT44(fStack_104,local_108);
                uStack_1b0 = CONCAT44(fStack_fc,fStack_100);
                pGVar61 = (context->scene->geometries).items[local_390].ptr;
                local_228 = local_368;
                fStack_224 = fStack_364;
                fStack_220 = fStack_360;
                fStack_21c = fStack_35c;
                local_218 = local_378;
                fStack_214 = fStack_374;
                fStack_210 = fStack_370;
                fStack_20c = fStack_36c;
                local_208 = local_388;
                fStack_204 = fStack_384;
                fStack_200 = fStack_380;
                fStack_1fc = fStack_37c;
                local_1f8 = uVar68;
                local_1a8 = auVar100;
                if ((pGVar61->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  puVar59 = (undefined1 *)0x0;
                  local_1f4 = iVar18;
                }
                else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                        (puVar59 = (undefined1 *)CONCAT71((int7)((ulong)context->args >> 8),1),
                        local_1f4 = iVar18, pGVar61->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  fVar147 = (float)(int)uVar68;
                  local_198[0] = (fVar147 + local_368 + 0.0) * local_68;
                  local_198[1] = (fVar147 + fStack_364 + 1.0) * fStack_64;
                  local_198[2] = (fVar147 + fStack_360 + 2.0) * fStack_60;
                  local_198[3] = (fVar147 + fStack_35c + 3.0) * fStack_5c;
                  local_188 = CONCAT44(fStack_374,local_378);
                  uStack_180 = CONCAT44(fStack_36c,fStack_370);
                  local_178[0] = local_388;
                  local_178[1] = fStack_384;
                  local_178[2] = fStack_380;
                  local_178[3] = fStack_37c;
                  uVar63 = (ulong)(uVar67 & 0xff);
                  uVar64 = 0;
                  if (uVar63 != 0) {
                    for (; ((uVar67 & 0xff) >> uVar64 & 1) == 0; uVar64 = uVar64 + 1) {
                    }
                  }
                  auVar74 = *local_328;
                  local_488._0_4_ = (uint)CONCAT71((int7)((ulong)local_328 >> 8),1);
                  local_1f4 = iVar18;
                  do {
                    local_c8 = local_198[uVar64];
                    uVar57 = *(undefined4 *)(ray + k * 4 + 0x80);
                    local_b8 = *(undefined4 *)((long)&local_188 + uVar64 * 4);
                    *(float *)(ray + k * 4 + 0x80) = local_178[uVar64];
                    fVar130 = 1.0 - local_c8;
                    fVar147 = local_c8 * 3.0;
                    fVar108 = ((fVar147 + 2.0) * (fVar130 + fVar130) + fVar130 * -3.0 * fVar130) *
                              0.5;
                    fVar73 = (local_c8 * local_c8 + fVar130 * -2.0 * local_c8) * 0.5;
                    fVar105 = (local_c8 * fVar147 + (fVar147 + -5.0) * (local_c8 + local_c8)) * 0.5;
                    local_318.context = context->user;
                    fVar147 = (local_c8 * (fVar130 + fVar130) - fVar130 * fVar130) * 0.5;
                    local_f8 = fVar147 * local_2c8 +
                               fVar105 * fVar283 + fVar108 * fVar274 + fVar73 * fVar295;
                    local_e8 = fVar147 * fStack_2c4 +
                               fVar105 * fVar284 + fVar108 * fVar281 + fVar73 * fVar297;
                    local_d8 = fVar147 * fStack_2c0 +
                               fVar105 * fVar293 + fVar108 * fVar282 + fVar73 * fVar300;
                    fStack_f4 = local_f8;
                    fStack_f0 = local_f8;
                    fStack_ec = local_f8;
                    fStack_e4 = local_e8;
                    fStack_e0 = local_e8;
                    fStack_dc = local_e8;
                    fStack_d4 = local_d8;
                    fStack_d0 = local_d8;
                    fStack_cc = local_d8;
                    fStack_c4 = local_c8;
                    fStack_c0 = local_c8;
                    fStack_bc = local_c8;
                    uStack_b4 = local_b8;
                    uStack_b0 = local_b8;
                    uStack_ac = local_b8;
                    local_a8 = local_2d8;
                    uStack_a0 = CONCAT44(uStack_2cc,uStack_2d0);
                    local_98 = local_2e8._0_8_;
                    uStack_90 = local_2e8._8_8_;
                    local_88 = (local_318.context)->instID[0];
                    uStack_84 = local_88;
                    uStack_80 = local_88;
                    uStack_7c = local_88;
                    local_78 = (local_318.context)->instPrimID[0];
                    uStack_74 = local_78;
                    uStack_70 = local_78;
                    uStack_6c = local_78;
                    local_428 = auVar74._0_8_;
                    uStack_420 = auVar74._8_8_;
                    local_3a8 = local_428;
                    uStack_3a0 = uStack_420;
                    local_318.valid = (int *)&local_3a8;
                    local_318.geometryUserPtr = pGVar61->userPtr;
                    local_318.hit = (RTCHitN *)&local_f8;
                    local_318.N = 4;
                    p_Var55 = pGVar61->occlusionFilterN;
                    local_318.ray = (RTCRayN *)ray;
                    if (p_Var55 != (RTCFilterFunctionN)0x0) {
                      p_Var55 = (RTCFilterFunctionN)(*p_Var55)(&local_318);
                    }
                    auVar101._0_4_ = -(uint)((int)local_3a8 == 0);
                    auVar101._4_4_ = -(uint)(local_3a8._4_4_ == 0);
                    auVar101._8_4_ = -(uint)((int)uStack_3a0 == 0);
                    auVar101._12_4_ = -(uint)(uStack_3a0._4_4_ == 0);
                    uVar67 = movmskps((int)p_Var55,auVar101);
                    pRVar56 = (RTCRayN *)(ulong)(uVar67 ^ 0xf);
                    if ((uVar67 ^ 0xf) == 0) {
                      auVar101 = auVar101 ^ _DAT_01febe20;
                    }
                    else {
                      p_Var55 = context->args->filter;
                      if ((p_Var55 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar61->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var55)(&local_318);
                      }
                      auVar129._0_4_ = -(uint)((int)local_3a8 == 0);
                      auVar129._4_4_ = -(uint)(local_3a8._4_4_ == 0);
                      auVar129._8_4_ = -(uint)((int)uStack_3a0 == 0);
                      auVar129._12_4_ = -(uint)(uStack_3a0._4_4_ == 0);
                      auVar101 = auVar129 ^ _DAT_01febe20;
                      *(undefined1 (*) [16])(local_318.ray + 0x80) =
                           ~auVar129 & _DAT_01feba00 |
                           *(undefined1 (*) [16])(local_318.ray + 0x80) & auVar129;
                      pRVar56 = local_318.ray;
                    }
                    auVar102._0_4_ = auVar101._0_4_ << 0x1f;
                    auVar102._4_4_ = auVar101._4_4_ << 0x1f;
                    auVar102._8_4_ = auVar101._8_4_ << 0x1f;
                    auVar102._12_4_ = auVar101._12_4_ << 0x1f;
                    iVar53 = movmskps((int)pRVar56,auVar102);
                    if (iVar53 != 0) break;
                    *(undefined4 *)(ray + k * 4 + 0x80) = uVar57;
                    uVar63 = uVar63 ^ 1L << (uVar64 & 0x3f);
                    uVar64 = 0;
                    if (uVar63 != 0) {
                      for (; (uVar63 >> uVar64 & 1) == 0; uVar64 = uVar64 + 1) {
                      }
                    }
                    local_488._0_4_ = (uint)(uVar63 != 0);
                  } while (uVar63 != 0);
                  puVar59 = (undefined1 *)(ulong)(uint)local_488;
                }
                bVar65 = (bool)(bVar65 | (byte)puVar59);
              }
            }
          }
          uVar57 = SUB84(puVar59,0);
          lVar62 = lVar62 + 4;
        } while ((int)lVar62 < iVar18);
      }
      if (bVar65 != false) {
        return local_4e9;
      }
      fVar147 = *(float *)(ray + k * 4 + 0x80);
      auVar127._4_4_ = -(uint)(fStack_44 <= fVar147);
      auVar127._0_4_ = -(uint)(local_48 <= fVar147);
      auVar127._8_4_ = -(uint)(fStack_40 <= fVar147);
      auVar127._12_4_ = -(uint)(fStack_3c <= fVar147);
      uVar67 = movmskps(uVar57,auVar127);
      uVar66 = uVar66 & uVar66 + 0xf & uVar67;
      local_4e9 = uVar66 != 0;
    } while (local_4e9);
  }
  return local_4e9;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }